

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  uint uVar48;
  int iVar49;
  ulong uVar50;
  byte bVar51;
  uint uVar52;
  long lVar53;
  uint uVar54;
  uint uVar55;
  ulong uVar57;
  ulong uVar58;
  bool bVar59;
  float fVar60;
  undefined4 uVar61;
  float fVar62;
  float fVar87;
  float fVar89;
  vint4 bi_2;
  undefined1 auVar63 [16];
  float fVar91;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar88;
  float fVar90;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar92;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined8 uVar93;
  vint4 bi_1;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar123;
  vint4 ai_2;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar137;
  float fVar146;
  vint4 ai;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  vint4 bi;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  float fVar162;
  float fVar163;
  float fVar180;
  float fVar181;
  vfloat4 b0_1;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar182;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  float fVar194;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar186 [16];
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar195;
  undefined1 auVar193 [32];
  float fVar199;
  float fVar211;
  vint4 ai_1;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar212;
  float fVar227;
  vfloat4 a0_2;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar228;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  vfloat4 a0_3;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar247;
  float fVar261;
  float fVar262;
  vfloat4 a0_1;
  undefined1 auVar252 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar263;
  undefined1 auVar250 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar251 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  vfloat4 a0;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar274 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar286 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_780 [8];
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 local_720 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  undefined4 local_530;
  undefined4 local_520;
  uint auStack_500 [4];
  RTCFilterFunctionNArguments local_4f0;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  uint uStack_320;
  float afStack_31c [7];
  undefined1 local_300 [32];
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar56;
  undefined1 auVar285 [32];
  
  PVar3 = prim[1];
  uVar57 = (ulong)(byte)PVar3;
  fVar60 = *(float *)(prim + uVar57 * 0x19 + 0x12);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar57 * 0x19 + 6));
  auVar63._0_4_ = fVar60 * auVar8._0_4_;
  auVar63._4_4_ = fVar60 * auVar8._4_4_;
  auVar63._8_4_ = fVar60 * auVar8._8_4_;
  auVar63._12_4_ = fVar60 * auVar8._12_4_;
  auVar75._0_4_ = fVar60 * auVar9._0_4_;
  auVar75._4_4_ = fVar60 * auVar9._4_4_;
  auVar75._8_4_ = fVar60 * auVar9._8_4_;
  auVar75._12_4_ = fVar60 * auVar9._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar282 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 6 + 6)));
  auVar282 = vcvtdq2ps_avx(auVar282);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar57 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  uVar50 = (ulong)(uint)((int)(uVar57 * 9) * 2);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 + uVar57 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  uVar50 = (ulong)(uint)((int)(uVar57 * 5) << 2);
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 + 6)));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar272._4_4_ = auVar75._0_4_;
  auVar272._0_4_ = auVar75._0_4_;
  auVar272._8_4_ = auVar75._0_4_;
  auVar272._12_4_ = auVar75._0_4_;
  auVar95 = vshufps_avx(auVar75,auVar75,0x55);
  auVar64 = vshufps_avx(auVar75,auVar75,0xaa);
  fVar60 = auVar64._0_4_;
  auVar241._0_4_ = fVar60 * auVar282._0_4_;
  fVar87 = auVar64._4_4_;
  auVar241._4_4_ = fVar87 * auVar282._4_4_;
  fVar89 = auVar64._8_4_;
  auVar241._8_4_ = fVar89 * auVar282._8_4_;
  fVar91 = auVar64._12_4_;
  auVar241._12_4_ = fVar91 * auVar282._12_4_;
  auVar128._0_4_ = auVar13._0_4_ * fVar60;
  auVar128._4_4_ = auVar13._4_4_ * fVar87;
  auVar128._8_4_ = auVar13._8_4_ * fVar89;
  auVar128._12_4_ = auVar13._12_4_ * fVar91;
  auVar243._0_4_ = auVar113._0_4_ * fVar60;
  auVar243._4_4_ = auVar113._4_4_ * fVar87;
  auVar243._8_4_ = auVar113._8_4_ * fVar89;
  auVar243._12_4_ = auVar113._12_4_ * fVar91;
  auVar64 = vfmadd231ps_fma(auVar241,auVar95,auVar9);
  auVar96 = vfmadd231ps_fma(auVar128,auVar95,auVar12);
  auVar95 = vfmadd231ps_fma(auVar243,auVar65,auVar95);
  auVar124 = vfmadd231ps_fma(auVar64,auVar272,auVar8);
  auVar96 = vfmadd231ps_fma(auVar96,auVar272,auVar11);
  auVar138 = vfmadd231ps_fma(auVar95,auVar66,auVar272);
  auVar273._4_4_ = auVar63._0_4_;
  auVar273._0_4_ = auVar63._0_4_;
  auVar273._8_4_ = auVar63._0_4_;
  auVar273._12_4_ = auVar63._0_4_;
  auVar95 = vshufps_avx(auVar63,auVar63,0x55);
  auVar64 = vshufps_avx(auVar63,auVar63,0xaa);
  fVar60 = auVar64._0_4_;
  auVar147._0_4_ = fVar60 * auVar282._0_4_;
  fVar87 = auVar64._4_4_;
  auVar147._4_4_ = fVar87 * auVar282._4_4_;
  fVar89 = auVar64._8_4_;
  auVar147._8_4_ = fVar89 * auVar282._8_4_;
  fVar91 = auVar64._12_4_;
  auVar147._12_4_ = fVar91 * auVar282._12_4_;
  auVar94._0_4_ = auVar13._0_4_ * fVar60;
  auVar94._4_4_ = auVar13._4_4_ * fVar87;
  auVar94._8_4_ = auVar13._8_4_ * fVar89;
  auVar94._12_4_ = auVar13._12_4_ * fVar91;
  auVar64._0_4_ = auVar113._0_4_ * fVar60;
  auVar64._4_4_ = auVar113._4_4_ * fVar87;
  auVar64._8_4_ = auVar113._8_4_ * fVar89;
  auVar64._12_4_ = auVar113._12_4_ * fVar91;
  auVar9 = vfmadd231ps_fma(auVar147,auVar95,auVar9);
  auVar282 = vfmadd231ps_fma(auVar94,auVar95,auVar12);
  auVar12 = vfmadd231ps_fma(auVar64,auVar95,auVar65);
  auVar13 = vfmadd231ps_fma(auVar9,auVar273,auVar8);
  auVar65 = vfmadd231ps_fma(auVar282,auVar273,auVar11);
  auVar113 = vfmadd231ps_fma(auVar12,auVar273,auVar66);
  auVar248._8_4_ = 0x7fffffff;
  auVar248._0_8_ = 0x7fffffff7fffffff;
  auVar248._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx(auVar124,auVar248);
  auVar252._8_4_ = 0x219392ef;
  auVar252._0_8_ = 0x219392ef219392ef;
  auVar252._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar252,1);
  auVar9 = vblendvps_avx(auVar124,auVar252,auVar8);
  auVar8 = vandps_avx(auVar96,auVar248);
  auVar8 = vcmpps_avx(auVar8,auVar252,1);
  auVar282 = vblendvps_avx(auVar96,auVar252,auVar8);
  auVar8 = vandps_avx(auVar138,auVar248);
  auVar8 = vcmpps_avx(auVar8,auVar252,1);
  auVar8 = vblendvps_avx(auVar138,auVar252,auVar8);
  auVar11 = vrcpps_avx(auVar9);
  auVar183._8_4_ = 0x3f800000;
  auVar183._0_8_ = 0x3f8000003f800000;
  auVar183._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar11,auVar183);
  auVar11 = vfmadd132ps_fma(auVar9,auVar11,auVar11);
  auVar9 = vrcpps_avx(auVar282);
  auVar282 = vfnmadd213ps_fma(auVar282,auVar9,auVar183);
  auVar12 = vfmadd132ps_fma(auVar282,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar183);
  auVar66 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar57 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar13);
  auVar138._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar138._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar138._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar138._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar57 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar13);
  auVar148._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar148._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar148._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar148._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar96._1_3_ = 0;
  auVar96[0] = PVar3;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar282);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar57 * -2 + 6);
  auVar8 = vpmovsxwd_avx(auVar11);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar65);
  auVar200._0_4_ = auVar8._0_4_ * auVar12._0_4_;
  auVar200._4_4_ = auVar8._4_4_ * auVar12._4_4_;
  auVar200._8_4_ = auVar8._8_4_ * auVar12._8_4_;
  auVar200._12_4_ = auVar8._12_4_ * auVar12._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar9);
  auVar8 = vsubps_avx(auVar8,auVar65);
  auVar95._0_4_ = auVar12._0_4_ * auVar8._0_4_;
  auVar95._4_4_ = auVar12._4_4_ * auVar8._4_4_;
  auVar95._8_4_ = auVar12._8_4_ * auVar8._8_4_;
  auVar95._12_4_ = auVar12._12_4_ * auVar8._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar50 + uVar57 + 6);
  auVar8 = vpmovsxwd_avx(auVar12);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar113);
  auVar124._0_4_ = auVar66._0_4_ * auVar8._0_4_;
  auVar124._4_4_ = auVar66._4_4_ * auVar8._4_4_;
  auVar124._8_4_ = auVar66._8_4_ * auVar8._8_4_;
  auVar124._12_4_ = auVar66._12_4_ * auVar8._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar57 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar13);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar113);
  auVar65._0_4_ = auVar66._0_4_ * auVar8._0_4_;
  auVar65._4_4_ = auVar66._4_4_ * auVar8._4_4_;
  auVar65._8_4_ = auVar66._8_4_ * auVar8._8_4_;
  auVar65._12_4_ = auVar66._12_4_ * auVar8._12_4_;
  auVar8 = vpminsd_avx(auVar138,auVar148);
  auVar9 = vpminsd_avx(auVar200,auVar95);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vpminsd_avx(auVar124,auVar65);
  uVar61 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar213._4_4_ = uVar61;
  auVar213._0_4_ = uVar61;
  auVar213._8_4_ = uVar61;
  auVar213._12_4_ = uVar61;
  auVar9 = vmaxps_avx(auVar9,auVar213);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  local_420._0_4_ = auVar8._0_4_ * 0.99999964;
  local_420._4_4_ = auVar8._4_4_ * 0.99999964;
  local_420._8_4_ = auVar8._8_4_ * 0.99999964;
  local_420._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar138,auVar148);
  auVar9 = vpmaxsd_avx(auVar200,auVar95);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar9 = vpmaxsd_avx(auVar124,auVar65);
  uVar61 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar113._4_4_ = uVar61;
  auVar113._0_4_ = uVar61;
  auVar113._8_4_ = uVar61;
  auVar113._12_4_ = uVar61;
  auVar9 = vminps_avx(auVar9,auVar113);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar66._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar66._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar66._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar66._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar96[4] = PVar3;
  auVar96._5_3_ = 0;
  auVar96[8] = PVar3;
  auVar96._9_3_ = 0;
  auVar96[0xc] = PVar3;
  auVar96._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar96,_DAT_01f7fcf0);
  auVar8 = vcmpps_avx(local_420,auVar66,2);
  auVar8 = vandps_avx(auVar8,auVar9);
  uVar48 = vmovmskps_avx(auVar8);
  if (uVar48 == 0) {
    return false;
  }
  uVar48 = uVar48 & 0xff;
  auVar83._16_16_ = mm_lookupmask_ps._240_16_;
  auVar83._0_16_ = mm_lookupmask_ps._240_16_;
  local_2a0 = vblendps_avx(auVar83,ZEXT832(0) << 0x20,0x80);
  iVar49 = 1 << ((uint)k & 0x1f);
  auVar84._4_4_ = iVar49;
  auVar84._0_4_ = iVar49;
  auVar84._8_4_ = iVar49;
  auVar84._12_4_ = iVar49;
  auVar84._16_4_ = iVar49;
  auVar84._20_4_ = iVar49;
  auVar84._24_4_ = iVar49;
  auVar84._28_4_ = iVar49;
  auVar15 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar83 = vpand_avx2(auVar84,auVar15);
  local_300 = vpcmpeqd_avx2(auVar83,auVar15);
LAB_015d732d:
  lVar53 = 0;
  uVar57 = (ulong)uVar48;
  for (uVar50 = uVar57; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
    lVar53 = lVar53 + 1;
  }
  uVar48 = *(uint *)(prim + 2);
  local_2e0 = *(uint *)(prim + lVar53 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar48].ptr;
  uVar50 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_2e0);
  p_Var5 = pGVar4[1].intersectionFilterN;
  pvVar6 = pGVar4[2].userPtr;
  _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar13 = *(undefined1 (*) [16])(_Var7 + uVar50 * (long)pvVar6);
  auVar8 = *(undefined1 (*) [16])(_Var7 + (uVar50 + 1) * (long)pvVar6);
  auVar9 = *(undefined1 (*) [16])(_Var7 + (uVar50 + 2) * (long)pvVar6);
  pfVar1 = (float *)(_Var7 + (long)pvVar6 * (uVar50 + 3));
  fVar60 = *pfVar1;
  fVar87 = pfVar1[1];
  fVar89 = pfVar1[2];
  fVar91 = pfVar1[3];
  lVar53 = *(long *)&pGVar4[1].time_range.upper;
  auVar282 = *(undefined1 (*) [16])(lVar53 + (long)p_Var5 * uVar50);
  auVar11 = *(undefined1 (*) [16])(lVar53 + (long)p_Var5 * (uVar50 + 1));
  auVar12 = *(undefined1 (*) [16])(lVar53 + (long)p_Var5 * (uVar50 + 2));
  uVar57 = uVar57 - 1 & uVar57;
  pfVar1 = (float *)(lVar53 + (long)p_Var5 * (uVar50 + 3));
  fVar162 = *pfVar1;
  fVar180 = pfVar1[1];
  fVar181 = pfVar1[2];
  fVar182 = pfVar1[3];
  if (uVar57 != 0) {
    uVar58 = uVar57 - 1 & uVar57;
    for (uVar50 = uVar57; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
    }
    if (uVar58 != 0) {
      for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar66 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar66 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar97._0_4_ = fVar162 * 0.0;
  auVar97._4_4_ = fVar180 * 0.0;
  auVar97._8_4_ = fVar181 * 0.0;
  auVar97._12_4_ = fVar182 * 0.0;
  auVar274._8_4_ = 0x3e2aaaab;
  auVar274._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar274._12_4_ = 0x3e2aaaab;
  auVar65 = vfmadd213ps_fma(auVar274,auVar12,auVar97);
  auVar201._8_4_ = 0x3f2aaaab;
  auVar201._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar201._12_4_ = 0x3f2aaaab;
  auVar65 = vfmadd231ps_fma(auVar65,auVar11,auVar201);
  auVar113 = vfmadd231ps_fma(auVar65,auVar282,auVar274);
  auVar67._8_4_ = 0x3f000000;
  auVar67._0_8_ = 0x3f0000003f000000;
  auVar67._12_4_ = 0x3f000000;
  auVar65 = vfmadd231ps_fma(auVar97,auVar12,auVar67);
  auVar65 = vfnmadd231ps_fma(auVar65,auVar11,ZEXT816(0) << 0x40);
  auVar64 = vfnmadd231ps_fma(auVar65,auVar282,auVar67);
  auVar249._0_4_ = fVar60 * 0.0;
  auVar249._4_4_ = fVar87 * 0.0;
  auVar249._8_4_ = fVar89 * 0.0;
  auVar249._12_4_ = fVar91 * 0.0;
  auVar65 = vfmadd213ps_fma(auVar274,auVar9,auVar249);
  auVar65 = vfmadd231ps_fma(auVar65,auVar8,auVar201);
  auVar65 = vfmadd231ps_fma(auVar65,auVar13,auVar274);
  auVar95 = vfmadd231ps_fma(auVar249,auVar9,auVar67);
  auVar95 = vfnmadd231ps_fma(auVar95,auVar8,(undefined1  [16])0x0);
  auVar96 = vfnmadd231ps_fma(auVar95,auVar13,auVar67);
  auVar125._0_4_ = fVar162 * 0.16666667;
  auVar125._4_4_ = fVar180 * 0.16666667;
  auVar125._8_4_ = fVar181 * 0.16666667;
  auVar125._12_4_ = fVar182 * 0.16666667;
  auVar95 = vfmadd231ps_fma(auVar125,auVar12,auVar201);
  auVar95 = vfmadd231ps_fma(auVar95,auVar11,auVar274);
  auVar95 = vfmadd231ps_fma(auVar95,auVar282,(undefined1  [16])0x0);
  auVar139._0_4_ = fVar162 * 0.5;
  auVar139._4_4_ = fVar180 * 0.5;
  auVar139._8_4_ = fVar181 * 0.5;
  auVar139._12_4_ = fVar182 * 0.5;
  auVar12 = vfmadd231ps_fma(auVar139,(undefined1  [16])0x0,auVar12);
  auVar11 = vfnmadd231ps_fma(auVar12,auVar67,auVar11);
  auVar124 = vfnmadd231ps_fma(auVar11,(undefined1  [16])0x0,auVar282);
  auVar214._0_4_ = fVar60 * 0.16666667;
  auVar214._4_4_ = fVar87 * 0.16666667;
  auVar214._8_4_ = fVar89 * 0.16666667;
  auVar214._12_4_ = fVar91 * 0.16666667;
  auVar114._8_4_ = 0x3f2aaaab;
  auVar114._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar114._12_4_ = 0x3f2aaaab;
  auVar282 = vfmadd231ps_fma(auVar214,auVar9,auVar114);
  auVar282 = vfmadd231ps_fma(auVar282,auVar8,auVar274);
  auVar12 = vfmadd231ps_fma(auVar282,auVar13,(undefined1  [16])0x0);
  auVar229._0_4_ = fVar60 * 0.5;
  auVar229._4_4_ = fVar87 * 0.5;
  auVar229._8_4_ = fVar89 * 0.5;
  auVar229._12_4_ = fVar91 * 0.5;
  auVar9 = vfmadd231ps_fma(auVar229,(undefined1  [16])0x0,auVar9);
  auVar8 = vfnmadd231ps_fma(auVar9,auVar67,auVar8);
  auVar13 = vfnmadd231ps_fma(auVar8,(undefined1  [16])0x0,auVar13);
  auVar8 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar9 = vshufps_avx(auVar65,auVar65,0xc9);
  fVar123 = auVar64._0_4_;
  auVar164._0_4_ = fVar123 * auVar9._0_4_;
  fVar88 = auVar64._4_4_;
  auVar164._4_4_ = fVar88 * auVar9._4_4_;
  fVar90 = auVar64._8_4_;
  auVar164._8_4_ = fVar90 * auVar9._8_4_;
  fVar163 = auVar64._12_4_;
  auVar164._12_4_ = fVar163 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar164,auVar8,auVar65);
  auVar282 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar96,auVar96,0xc9);
  auVar165._0_4_ = fVar123 * auVar9._0_4_;
  auVar165._4_4_ = fVar88 * auVar9._4_4_;
  auVar165._8_4_ = fVar90 * auVar9._8_4_;
  auVar165._12_4_ = fVar163 * auVar9._12_4_;
  auVar8 = vfmsub231ps_fma(auVar165,auVar8,auVar96);
  auVar11 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar124,auVar124,0xc9);
  auVar9 = vshufps_avx(auVar12,auVar12,0xc9);
  fVar62 = auVar124._0_4_;
  auVar149._0_4_ = fVar62 * auVar9._0_4_;
  fVar228 = auVar124._4_4_;
  auVar149._4_4_ = fVar228 * auVar9._4_4_;
  fVar137 = auVar124._8_4_;
  auVar149._8_4_ = fVar137 * auVar9._8_4_;
  fVar146 = auVar124._12_4_;
  auVar149._12_4_ = fVar146 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar149,auVar8,auVar12);
  auVar12 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar184._0_4_ = fVar62 * auVar9._0_4_;
  auVar184._4_4_ = fVar228 * auVar9._4_4_;
  auVar184._8_4_ = fVar137 * auVar9._8_4_;
  auVar184._12_4_ = fVar146 * auVar9._12_4_;
  auVar8 = vfmsub231ps_fma(auVar184,auVar8,auVar13);
  auVar13 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vdpps_avx(auVar282,auVar282,0x7f);
  fVar87 = auVar8._0_4_;
  auVar65 = ZEXT416((uint)fVar87);
  auVar9 = vrsqrtss_avx(auVar65,auVar65);
  fVar60 = auVar9._0_4_;
  fVar60 = fVar60 * 1.5 + fVar87 * -0.5 * fVar60 * fVar60 * fVar60;
  auVar9 = vdpps_avx(auVar282,auVar11,0x7f);
  fVar162 = auVar282._0_4_ * fVar60;
  fVar180 = auVar282._4_4_ * fVar60;
  fVar181 = auVar282._8_4_ * fVar60;
  fVar182 = auVar282._12_4_ * fVar60;
  auVar242._0_4_ = auVar11._0_4_ * fVar87;
  auVar242._4_4_ = auVar11._4_4_ * fVar87;
  auVar242._8_4_ = auVar11._8_4_ * fVar87;
  auVar242._12_4_ = auVar11._12_4_ * fVar87;
  fVar87 = auVar9._0_4_;
  auVar202._0_4_ = auVar282._0_4_ * fVar87;
  auVar202._4_4_ = auVar282._4_4_ * fVar87;
  auVar202._8_4_ = auVar282._8_4_ * fVar87;
  auVar202._12_4_ = auVar282._12_4_ * fVar87;
  auVar282 = vsubps_avx(auVar242,auVar202);
  auVar9 = vrcpss_avx(auVar65,auVar65);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar89 = auVar9._0_4_ * auVar8._0_4_;
  auVar8 = vdpps_avx(auVar12,auVar12,0x7f);
  fVar91 = auVar8._0_4_;
  auVar65 = ZEXT416((uint)fVar91);
  auVar9 = vrsqrtss_avx(auVar65,auVar65);
  fVar87 = auVar9._0_4_;
  auVar9 = vdpps_avx(auVar12,auVar13,0x7f);
  fVar87 = fVar87 * 1.5 + fVar91 * -0.5 * fVar87 * fVar87 * fVar87;
  fVar247 = fVar87 * auVar12._0_4_;
  fVar261 = fVar87 * auVar12._4_4_;
  fVar262 = fVar87 * auVar12._8_4_;
  fVar263 = fVar87 * auVar12._12_4_;
  auVar185._0_4_ = fVar91 * auVar13._0_4_;
  auVar185._4_4_ = fVar91 * auVar13._4_4_;
  auVar185._8_4_ = fVar91 * auVar13._8_4_;
  auVar185._12_4_ = fVar91 * auVar13._12_4_;
  fVar91 = auVar9._0_4_;
  auVar150._0_4_ = fVar91 * auVar12._0_4_;
  auVar150._4_4_ = fVar91 * auVar12._4_4_;
  auVar150._8_4_ = fVar91 * auVar12._8_4_;
  auVar150._12_4_ = fVar91 * auVar12._12_4_;
  auVar11 = vsubps_avx(auVar185,auVar150);
  auVar9 = vrcpss_avx(auVar65,auVar65);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,ZEXT416(0x40000000));
  fVar91 = auVar8._0_4_ * auVar9._0_4_;
  auVar8 = vshufps_avx(auVar113,auVar113,0xff);
  auVar215._0_4_ = auVar8._0_4_ * fVar162;
  auVar215._4_4_ = auVar8._4_4_ * fVar180;
  auVar215._8_4_ = auVar8._8_4_ * fVar181;
  auVar215._12_4_ = auVar8._12_4_ * fVar182;
  auVar65 = vsubps_avx(auVar113,auVar215);
  auVar9 = vshufps_avx(auVar64,auVar64,0xff);
  auVar166._0_4_ = auVar9._0_4_ * fVar162 + fVar60 * auVar282._0_4_ * fVar89 * auVar8._0_4_;
  auVar166._4_4_ = auVar9._4_4_ * fVar180 + fVar60 * auVar282._4_4_ * fVar89 * auVar8._4_4_;
  auVar166._8_4_ = auVar9._8_4_ * fVar181 + fVar60 * auVar282._8_4_ * fVar89 * auVar8._8_4_;
  auVar166._12_4_ = auVar9._12_4_ * fVar182 + fVar60 * auVar282._12_4_ * fVar89 * auVar8._12_4_;
  auVar282 = vsubps_avx(auVar64,auVar166);
  auVar230._0_4_ = auVar113._0_4_ + auVar215._0_4_;
  auVar230._4_4_ = auVar113._4_4_ + auVar215._4_4_;
  auVar230._8_4_ = auVar113._8_4_ + auVar215._8_4_;
  auVar230._12_4_ = auVar113._12_4_ + auVar215._12_4_;
  auVar8 = vshufps_avx(auVar95,auVar95,0xff);
  auVar115._0_4_ = fVar247 * auVar8._0_4_;
  auVar115._4_4_ = fVar261 * auVar8._4_4_;
  auVar115._8_4_ = fVar262 * auVar8._8_4_;
  auVar115._12_4_ = fVar263 * auVar8._12_4_;
  auVar113 = vsubps_avx(auVar95,auVar115);
  auVar9 = vshufps_avx(auVar124,auVar124,0xff);
  auVar98._0_4_ = fVar247 * auVar9._0_4_ + auVar8._0_4_ * fVar87 * auVar11._0_4_ * fVar91;
  auVar98._4_4_ = fVar261 * auVar9._4_4_ + auVar8._4_4_ * fVar87 * auVar11._4_4_ * fVar91;
  auVar98._8_4_ = fVar262 * auVar9._8_4_ + auVar8._8_4_ * fVar87 * auVar11._8_4_ * fVar91;
  auVar98._12_4_ = fVar263 * auVar9._12_4_ + auVar8._12_4_ * fVar87 * auVar11._12_4_ * fVar91;
  auVar8 = vsubps_avx(auVar124,auVar98);
  fVar162 = auVar95._0_4_ + auVar115._0_4_;
  fVar180 = auVar95._4_4_ + auVar115._4_4_;
  fVar181 = auVar95._8_4_ + auVar115._8_4_;
  fVar182 = auVar95._12_4_ + auVar115._12_4_;
  auVar126._0_4_ = auVar65._0_4_ + auVar282._0_4_ * 0.33333334;
  auVar126._4_4_ = auVar65._4_4_ + auVar282._4_4_ * 0.33333334;
  auVar126._8_4_ = auVar65._8_4_ + auVar282._8_4_ * 0.33333334;
  auVar126._12_4_ = auVar65._12_4_ + auVar282._12_4_ * 0.33333334;
  auVar99._0_4_ = auVar8._0_4_ * 0.33333334;
  auVar99._4_4_ = auVar8._4_4_ * 0.33333334;
  auVar99._8_4_ = auVar8._8_4_ * 0.33333334;
  auVar99._12_4_ = auVar8._12_4_ * 0.33333334;
  auVar95 = vsubps_avx(auVar113,auVar99);
  auVar64 = vsubps_avx(auVar65,auVar66);
  auVar8 = vshufps_avx(auVar64,auVar64,0x55);
  auVar9 = vshufps_avx(auVar64,auVar64,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar60 = pre->ray_space[k].vz.field_0.m128[0];
  fVar87 = pre->ray_space[k].vz.field_0.m128[1];
  fVar89 = pre->ray_space[k].vz.field_0.m128[2];
  fVar91 = pre->ray_space[k].vz.field_0.m128[3];
  auVar100._0_4_ = fVar60 * auVar9._0_4_;
  auVar100._4_4_ = fVar87 * auVar9._4_4_;
  auVar100._8_4_ = fVar89 * auVar9._8_4_;
  auVar100._12_4_ = fVar91 * auVar9._12_4_;
  auVar282 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar2,auVar8);
  auVar96 = vsubps_avx(auVar126,auVar66);
  auVar8 = vshufps_avx(auVar96,auVar96,0x55);
  auVar9 = vshufps_avx(auVar96,auVar96,0xaa);
  auVar280._0_4_ = fVar60 * auVar9._0_4_;
  auVar280._4_4_ = fVar87 * auVar9._4_4_;
  auVar280._8_4_ = fVar89 * auVar9._8_4_;
  auVar280._12_4_ = fVar91 * auVar9._12_4_;
  auVar9 = vfmadd231ps_fma(auVar280,(undefined1  [16])aVar2,auVar8);
  local_3b0 = vsubps_avx(auVar95,auVar66);
  auVar8 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar250._0_4_ = fVar60 * auVar8._0_4_;
  auVar250._4_4_ = fVar87 * auVar8._4_4_;
  auVar250._8_4_ = fVar89 * auVar8._8_4_;
  auVar250._12_4_ = fVar91 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_3b0,local_3b0,0x55);
  auVar11 = vfmadd231ps_fma(auVar250,(undefined1  [16])aVar2,auVar8);
  local_3c0 = vsubps_avx(auVar113,auVar66);
  auVar8 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar264._0_4_ = fVar60 * auVar8._0_4_;
  auVar264._4_4_ = fVar87 * auVar8._4_4_;
  auVar264._8_4_ = fVar89 * auVar8._8_4_;
  auVar264._12_4_ = fVar91 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_3c0,local_3c0,0x55);
  auVar12 = vfmadd231ps_fma(auVar264,(undefined1  [16])aVar2,auVar8);
  local_3d0 = vsubps_avx(auVar230,auVar66);
  auVar8 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar151._0_4_ = fVar60 * auVar8._0_4_;
  auVar151._4_4_ = fVar87 * auVar8._4_4_;
  auVar151._8_4_ = fVar89 * auVar8._8_4_;
  auVar151._12_4_ = fVar91 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_3d0,local_3d0,0x55);
  auVar13 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar2,auVar8);
  auVar68._0_4_ = (fVar123 + auVar166._0_4_) * 0.33333334 + auVar230._0_4_;
  auVar68._4_4_ = (fVar88 + auVar166._4_4_) * 0.33333334 + auVar230._4_4_;
  auVar68._8_4_ = (fVar90 + auVar166._8_4_) * 0.33333334 + auVar230._8_4_;
  auVar68._12_4_ = (fVar163 + auVar166._12_4_) * 0.33333334 + auVar230._12_4_;
  local_3e0 = vsubps_avx(auVar68,auVar66);
  auVar8 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar203._0_4_ = auVar8._0_4_ * fVar60;
  auVar203._4_4_ = auVar8._4_4_ * fVar87;
  auVar203._8_4_ = auVar8._8_4_ * fVar89;
  auVar203._12_4_ = auVar8._12_4_ * fVar91;
  auVar8 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar138 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar2,auVar8);
  auVar216._0_4_ = (fVar62 + auVar98._0_4_) * 0.33333334;
  auVar216._4_4_ = (fVar228 + auVar98._4_4_) * 0.33333334;
  auVar216._8_4_ = (fVar137 + auVar98._8_4_) * 0.33333334;
  auVar216._12_4_ = (fVar146 + auVar98._12_4_) * 0.33333334;
  auVar20._4_4_ = fVar180;
  auVar20._0_4_ = fVar162;
  auVar20._8_4_ = fVar181;
  auVar20._12_4_ = fVar182;
  auVar124 = vsubps_avx(auVar20,auVar216);
  local_3f0 = vsubps_avx(auVar124,auVar66);
  auVar8 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar217._0_4_ = auVar8._0_4_ * fVar60;
  auVar217._4_4_ = auVar8._4_4_ * fVar87;
  auVar217._8_4_ = auVar8._8_4_ * fVar89;
  auVar217._12_4_ = auVar8._12_4_ * fVar91;
  auVar8 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar63 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar2,auVar8);
  local_400 = vsubps_avx(auVar20,auVar66);
  auVar8 = vshufps_avx(local_400,local_400,0xaa);
  auVar69._0_4_ = fVar60 * auVar8._0_4_;
  auVar69._4_4_ = fVar87 * auVar8._4_4_;
  auVar69._8_4_ = fVar89 * auVar8._8_4_;
  auVar69._12_4_ = fVar91 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_400,local_400,0x55);
  auVar8 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar2,auVar8);
  local_520 = auVar64._0_4_;
  auVar167._4_4_ = local_520;
  auVar167._0_4_ = local_520;
  auVar167._8_4_ = local_520;
  auVar167._12_4_ = local_520;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar66 = vfmadd231ps_fma(auVar282,(undefined1  [16])aVar2,auVar167);
  local_530 = auVar96._0_4_;
  auVar168._4_4_ = local_530;
  auVar168._0_4_ = local_530;
  auVar168._8_4_ = local_530;
  auVar168._12_4_ = local_530;
  auVar94 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar168);
  uVar61 = local_3b0._0_4_;
  auVar169._4_4_ = uVar61;
  auVar169._0_4_ = uVar61;
  auVar169._8_4_ = uVar61;
  auVar169._12_4_ = uVar61;
  auVar252 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar2,auVar169);
  uVar61 = local_3c0._0_4_;
  auVar170._4_4_ = uVar61;
  auVar170._0_4_ = uVar61;
  auVar170._8_4_ = uVar61;
  auVar170._12_4_ = uVar61;
  auVar75 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar170);
  uVar61 = local_3d0._0_4_;
  auVar171._4_4_ = uVar61;
  auVar171._0_4_ = uVar61;
  auVar171._8_4_ = uVar61;
  auVar171._12_4_ = uVar61;
  auVar147 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar2,auVar171);
  uVar61 = local_3e0._0_4_;
  auVar172._4_4_ = uVar61;
  auVar172._0_4_ = uVar61;
  auVar172._8_4_ = uVar61;
  auVar172._12_4_ = uVar61;
  auVar138 = vfmadd231ps_fma(auVar138,(undefined1  [16])aVar2,auVar172);
  uVar61 = local_3f0._0_4_;
  auVar173._4_4_ = uVar61;
  auVar173._0_4_ = uVar61;
  auVar173._8_4_ = uVar61;
  auVar173._12_4_ = uVar61;
  auVar63 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar173);
  uVar61 = local_400._0_4_;
  auVar174._4_4_ = uVar61;
  auVar174._0_4_ = uVar61;
  auVar174._8_4_ = uVar61;
  auVar174._12_4_ = uVar61;
  auVar148 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar2,auVar174);
  auVar11 = vmovlhps_avx(auVar66,auVar147);
  auVar12 = vmovlhps_avx(auVar94,auVar138);
  auVar13 = vmovlhps_avx(auVar252,auVar63);
  _local_3a0 = vmovlhps_avx(auVar75,auVar148);
  auVar8 = vminps_avx(auVar11,auVar12);
  auVar9 = vminps_avx(auVar13,_local_3a0);
  auVar282 = vminps_avx(auVar8,auVar9);
  auVar8 = vmaxps_avx(auVar11,auVar12);
  auVar9 = vmaxps_avx(auVar13,_local_3a0);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vshufpd_avx(auVar282,auVar282,3);
  auVar282 = vminps_avx(auVar282,auVar9);
  auVar9 = vshufpd_avx(auVar8,auVar8,3);
  auVar9 = vmaxps_avx(auVar8,auVar9);
  auVar8 = vandps_avx(auVar248,auVar282);
  auVar9 = vandps_avx(auVar248,auVar9);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vmovshdup_avx(auVar8);
  auVar8 = vmaxss_avx(auVar9,auVar8);
  fVar87 = auVar8._0_4_ * 9.536743e-07;
  auVar186._8_8_ = auVar66._0_8_;
  auVar186._0_8_ = auVar66._0_8_;
  auVar231._8_8_ = auVar94._0_8_;
  auVar231._0_8_ = auVar94._0_8_;
  auVar251._0_8_ = auVar252._0_8_;
  auVar251._8_8_ = auVar251._0_8_;
  auVar265._0_8_ = auVar75._0_8_;
  auVar265._8_8_ = auVar265._0_8_;
  local_360 = -fVar87;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  local_2c0 = uVar48;
  uStack_2bc = uVar48;
  uStack_2b8 = uVar48;
  uStack_2b4 = uVar48;
  uStack_2b0 = uVar48;
  uStack_2ac = uVar48;
  uStack_2a8 = uVar48;
  uStack_2a4 = uVar48;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  bVar59 = false;
  uVar50 = 0;
  fVar60 = *(float *)(ray + k * 4 + 0x60);
  local_370 = vsubps_avx(auVar12,auVar11);
  local_380 = vsubps_avx(auVar13,auVar12);
  local_390 = vsubps_avx(_local_3a0,auVar13);
  local_430 = vsubps_avx(auVar230,auVar65);
  local_440 = vsubps_avx(auVar68,auVar126);
  local_450 = vsubps_avx(auVar124,auVar95);
  auVar232._4_4_ = fVar180;
  auVar232._0_4_ = fVar162;
  auVar232._8_4_ = fVar181;
  auVar232._12_4_ = fVar182;
  _local_460 = vsubps_avx(auVar232,auVar113);
  auVar70 = ZEXT816(0x3f80000000000000);
  local_340 = fVar87;
  fStack_33c = fVar87;
  fStack_338 = fVar87;
  fStack_334 = fVar87;
  fStack_330 = fVar87;
  fStack_32c = fVar87;
  fStack_328 = fVar87;
  fStack_324 = fVar87;
  local_410 = auVar70;
LAB_015d7b3e:
  auVar8 = vshufps_avx(auVar70,auVar70,0x50);
  auVar281._8_4_ = 0x3f800000;
  auVar281._0_8_ = 0x3f8000003f800000;
  auVar281._12_4_ = 0x3f800000;
  auVar285._16_4_ = 0x3f800000;
  auVar285._0_16_ = auVar281;
  auVar285._20_4_ = 0x3f800000;
  auVar285._24_4_ = 0x3f800000;
  auVar285._28_4_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar281,auVar8);
  fVar89 = auVar8._0_4_;
  fVar137 = auVar147._0_4_;
  auVar71._0_4_ = fVar137 * fVar89;
  fVar91 = auVar8._4_4_;
  fVar146 = auVar147._4_4_;
  auVar71._4_4_ = fVar146 * fVar91;
  fVar123 = auVar8._8_4_;
  auVar71._8_4_ = fVar137 * fVar123;
  fVar88 = auVar8._12_4_;
  auVar71._12_4_ = fVar146 * fVar88;
  fVar247 = auVar138._0_4_;
  auVar175._0_4_ = fVar247 * fVar89;
  fVar261 = auVar138._4_4_;
  auVar175._4_4_ = fVar261 * fVar91;
  auVar175._8_4_ = fVar247 * fVar123;
  auVar175._12_4_ = fVar261 * fVar88;
  fVar199 = auVar63._0_4_;
  auVar140._0_4_ = fVar199 * fVar89;
  fVar211 = auVar63._4_4_;
  auVar140._4_4_ = fVar211 * fVar91;
  auVar140._8_4_ = fVar199 * fVar123;
  auVar140._12_4_ = fVar211 * fVar88;
  fVar212 = auVar148._0_4_;
  auVar116._0_4_ = fVar212 * fVar89;
  fVar227 = auVar148._4_4_;
  auVar116._4_4_ = fVar227 * fVar91;
  auVar116._8_4_ = fVar212 * fVar123;
  auVar116._12_4_ = fVar227 * fVar88;
  auVar94 = vfmadd231ps_fma(auVar71,auVar9,auVar186);
  auVar252 = vfmadd231ps_fma(auVar175,auVar9,auVar231);
  auVar75 = vfmadd231ps_fma(auVar140,auVar9,auVar251);
  auVar183 = vfmadd231ps_fma(auVar116,auVar265,auVar9);
  auVar8 = vmovshdup_avx(local_410);
  fVar89 = local_410._0_4_;
  fStack_228 = (auVar8._0_4_ - fVar89) * 0.04761905;
  auVar225._4_4_ = fVar89;
  auVar225._0_4_ = fVar89;
  auVar225._8_4_ = fVar89;
  auVar225._12_4_ = fVar89;
  auVar225._16_4_ = fVar89;
  auVar225._20_4_ = fVar89;
  auVar225._24_4_ = fVar89;
  auVar225._28_4_ = fVar89;
  auVar108._0_8_ = auVar8._0_8_;
  auVar108._8_8_ = auVar108._0_8_;
  auVar108._16_8_ = auVar108._0_8_;
  auVar108._24_8_ = auVar108._0_8_;
  auVar83 = vsubps_avx(auVar108,auVar225);
  uVar61 = auVar94._0_4_;
  auVar278._4_4_ = uVar61;
  auVar278._0_4_ = uVar61;
  auVar278._8_4_ = uVar61;
  auVar278._12_4_ = uVar61;
  auVar278._16_4_ = uVar61;
  auVar278._20_4_ = uVar61;
  auVar278._24_4_ = uVar61;
  auVar278._28_4_ = uVar61;
  auVar8 = vmovshdup_avx(auVar94);
  uVar93 = auVar8._0_8_;
  auVar271._8_8_ = uVar93;
  auVar271._0_8_ = uVar93;
  auVar271._16_8_ = uVar93;
  auVar271._24_8_ = uVar93;
  fVar262 = auVar252._0_4_;
  auVar258._4_4_ = fVar262;
  auVar258._0_4_ = fVar262;
  auVar258._8_4_ = fVar262;
  auVar258._12_4_ = fVar262;
  auVar258._16_4_ = fVar262;
  auVar258._20_4_ = fVar262;
  auVar258._24_4_ = fVar262;
  auVar258._28_4_ = fVar262;
  auVar9 = vmovshdup_avx(auVar252);
  auVar109._0_8_ = auVar9._0_8_;
  auVar109._8_8_ = auVar109._0_8_;
  auVar109._16_8_ = auVar109._0_8_;
  auVar109._24_8_ = auVar109._0_8_;
  fVar228 = auVar75._0_4_;
  auVar191._4_4_ = fVar228;
  auVar191._0_4_ = fVar228;
  auVar191._8_4_ = fVar228;
  auVar191._12_4_ = fVar228;
  auVar191._16_4_ = fVar228;
  auVar191._20_4_ = fVar228;
  auVar191._24_4_ = fVar228;
  auVar191._28_4_ = fVar228;
  auVar282 = vmovshdup_avx(auVar75);
  auVar209._0_8_ = auVar282._0_8_;
  auVar209._8_8_ = auVar209._0_8_;
  auVar209._16_8_ = auVar209._0_8_;
  auVar209._24_8_ = auVar209._0_8_;
  fVar62 = auVar183._0_4_;
  auVar66 = vmovshdup_avx(auVar183);
  auVar243 = vfmadd132ps_fma(auVar83,auVar225,_DAT_01faff20);
  auVar83 = vsubps_avx(auVar285,ZEXT1632(auVar243));
  fVar89 = auVar243._0_4_;
  fVar91 = auVar243._4_4_;
  auVar15._4_4_ = fVar262 * fVar91;
  auVar15._0_4_ = fVar262 * fVar89;
  fVar123 = auVar243._8_4_;
  auVar15._8_4_ = fVar262 * fVar123;
  fVar88 = auVar243._12_4_;
  auVar15._12_4_ = fVar262 * fVar88;
  auVar15._16_4_ = fVar262 * 0.0;
  auVar15._20_4_ = fVar262 * 0.0;
  auVar15._24_4_ = fVar262 * 0.0;
  auVar15._28_4_ = 0x3f800000;
  auVar243 = vfmadd231ps_fma(auVar15,auVar83,auVar278);
  fVar90 = auVar9._0_4_;
  fVar163 = auVar9._4_4_;
  auVar14._4_4_ = fVar163 * fVar91;
  auVar14._0_4_ = fVar90 * fVar89;
  auVar14._8_4_ = fVar90 * fVar123;
  auVar14._12_4_ = fVar163 * fVar88;
  auVar14._16_4_ = fVar90 * 0.0;
  auVar14._20_4_ = fVar163 * 0.0;
  auVar14._24_4_ = fVar90 * 0.0;
  auVar14._28_4_ = uVar61;
  auVar200 = vfmadd231ps_fma(auVar14,auVar83,auVar271);
  auVar10._4_4_ = fVar228 * fVar91;
  auVar10._0_4_ = fVar228 * fVar89;
  auVar10._8_4_ = fVar228 * fVar123;
  auVar10._12_4_ = fVar228 * fVar88;
  auVar10._16_4_ = fVar228 * 0.0;
  auVar10._20_4_ = fVar228 * 0.0;
  auVar10._24_4_ = fVar228 * 0.0;
  auVar10._28_4_ = auVar8._4_4_;
  auVar213 = vfmadd231ps_fma(auVar10,auVar83,auVar258);
  fVar90 = auVar282._0_4_;
  fVar163 = auVar282._4_4_;
  auVar16._4_4_ = fVar163 * fVar91;
  auVar16._0_4_ = fVar90 * fVar89;
  auVar16._8_4_ = fVar90 * fVar123;
  auVar16._12_4_ = fVar163 * fVar88;
  auVar16._16_4_ = fVar90 * 0.0;
  auVar16._20_4_ = fVar163 * 0.0;
  auVar16._24_4_ = fVar90 * 0.0;
  auVar16._28_4_ = fVar262;
  auVar128 = vfmadd231ps_fma(auVar16,auVar83,auVar109);
  auVar8 = vshufps_avx(auVar94,auVar94,0xaa);
  local_720._8_8_ = auVar8._0_8_;
  local_720._0_8_ = local_720._8_8_;
  local_720._16_8_ = local_720._8_8_;
  local_720._24_8_ = local_720._8_8_;
  auVar9 = vshufps_avx(auVar94,auVar94,0xff);
  uStack_778 = auVar9._0_8_;
  local_780 = (undefined1  [8])uStack_778;
  uStack_770 = uStack_778;
  uStack_768 = uStack_778;
  auVar17._4_4_ = fVar62 * fVar91;
  auVar17._0_4_ = fVar62 * fVar89;
  auVar17._8_4_ = fVar62 * fVar123;
  auVar17._12_4_ = fVar62 * fVar88;
  auVar17._16_4_ = fVar62 * 0.0;
  auVar17._20_4_ = fVar62 * 0.0;
  auVar17._24_4_ = fVar62 * 0.0;
  auVar17._28_4_ = fVar62;
  auVar94 = vfmadd231ps_fma(auVar17,auVar83,auVar191);
  auVar9 = vshufps_avx(auVar252,auVar252,0xaa);
  auVar192._0_8_ = auVar9._0_8_;
  auVar192._8_8_ = auVar192._0_8_;
  auVar192._16_8_ = auVar192._0_8_;
  auVar192._24_8_ = auVar192._0_8_;
  auVar282 = vshufps_avx(auVar252,auVar252,0xff);
  local_600._8_8_ = auVar282._0_8_;
  local_600._0_8_ = local_600._8_8_;
  local_600._16_8_ = local_600._8_8_;
  local_600._24_8_ = local_600._8_8_;
  fVar90 = auVar66._0_4_;
  fVar163 = auVar66._4_4_;
  auVar18._4_4_ = fVar163 * fVar91;
  auVar18._0_4_ = fVar90 * fVar89;
  auVar18._8_4_ = fVar90 * fVar123;
  auVar18._12_4_ = fVar163 * fVar88;
  auVar18._16_4_ = fVar90 * 0.0;
  auVar18._20_4_ = fVar163 * 0.0;
  auVar18._24_4_ = fVar90 * 0.0;
  auVar18._28_4_ = auVar8._4_4_;
  auVar241 = vfmadd231ps_fma(auVar18,auVar83,auVar209);
  auVar19._28_4_ = fVar163;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar213._12_4_ * fVar88,
                          CONCAT48(auVar213._8_4_ * fVar123,
                                   CONCAT44(auVar213._4_4_ * fVar91,auVar213._0_4_ * fVar89))));
  auVar243 = vfmadd231ps_fma(auVar19,auVar83,ZEXT1632(auVar243));
  fVar90 = auVar282._4_4_;
  auVar260._28_4_ = fVar90;
  auVar260._0_28_ =
       ZEXT1628(CONCAT412(auVar128._12_4_ * fVar88,
                          CONCAT48(auVar128._8_4_ * fVar123,
                                   CONCAT44(auVar128._4_4_ * fVar91,auVar128._0_4_ * fVar89))));
  auVar200 = vfmadd231ps_fma(auVar260,auVar83,ZEXT1632(auVar200));
  auVar8 = vshufps_avx(auVar75,auVar75,0xaa);
  uVar93 = auVar8._0_8_;
  auVar179._8_8_ = uVar93;
  auVar179._0_8_ = uVar93;
  auVar179._16_8_ = uVar93;
  auVar179._24_8_ = uVar93;
  auVar66 = vshufps_avx(auVar75,auVar75,0xff);
  uVar93 = auVar66._0_8_;
  auVar286._8_8_ = uVar93;
  auVar286._0_8_ = uVar93;
  auVar286._16_8_ = uVar93;
  auVar286._24_8_ = uVar93;
  auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar94._12_4_ * fVar88,
                                               CONCAT48(auVar94._8_4_ * fVar123,
                                                        CONCAT44(auVar94._4_4_ * fVar91,
                                                                 auVar94._0_4_ * fVar89)))),auVar83,
                            ZEXT1632(auVar213));
  auVar94 = vshufps_avx(auVar183,auVar183,0xaa);
  auVar252 = vshufps_avx(auVar183,auVar183,0xff);
  auVar183 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar88 * auVar241._12_4_,
                                                CONCAT48(fVar123 * auVar241._8_4_,
                                                         CONCAT44(fVar91 * auVar241._4_4_,
                                                                  fVar89 * auVar241._0_4_)))),
                             auVar83,ZEXT1632(auVar128));
  auVar213 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar88 * auVar75._12_4_,
                                                CONCAT48(fVar123 * auVar75._8_4_,
                                                         CONCAT44(fVar91 * auVar75._4_4_,
                                                                  fVar89 * auVar75._0_4_)))),auVar83
                             ,ZEXT1632(auVar243));
  auVar15 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar243));
  auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar88 * auVar183._12_4_,
                                               CONCAT48(fVar123 * auVar183._8_4_,
                                                        CONCAT44(fVar91 * auVar183._4_4_,
                                                                 fVar89 * auVar183._0_4_)))),auVar83
                            ,ZEXT1632(auVar200));
  auVar84 = vsubps_avx(ZEXT1632(auVar183),ZEXT1632(auVar200));
  fStack_5c4 = auVar84._28_4_;
  auVar259._0_4_ = fStack_228 * auVar15._0_4_ * 3.0;
  auVar259._4_4_ = fStack_228 * auVar15._4_4_ * 3.0;
  auVar259._8_4_ = fStack_228 * auVar15._8_4_ * 3.0;
  auVar259._12_4_ = fStack_228 * auVar15._12_4_ * 3.0;
  auVar259._16_4_ = fStack_228 * auVar15._16_4_ * 3.0;
  auVar259._20_4_ = fStack_228 * auVar15._20_4_ * 3.0;
  auVar259._24_4_ = fStack_228 * auVar15._24_4_ * 3.0;
  auVar259._28_4_ = 0;
  local_5e0._0_4_ = fStack_228 * auVar84._0_4_ * 3.0;
  local_5e0._4_4_ = fStack_228 * auVar84._4_4_ * 3.0;
  fStack_5d8 = fStack_228 * auVar84._8_4_ * 3.0;
  fStack_5d4 = fStack_228 * auVar84._12_4_ * 3.0;
  fStack_5d0 = fStack_228 * auVar84._16_4_ * 3.0;
  fStack_5cc = fStack_228 * auVar84._20_4_ * 3.0;
  fStack_5c8 = fStack_228 * auVar84._24_4_ * 3.0;
  fVar163 = auVar9._0_4_;
  fVar62 = auVar9._4_4_;
  auVar21._4_4_ = fVar62 * fVar91;
  auVar21._0_4_ = fVar163 * fVar89;
  auVar21._8_4_ = fVar163 * fVar123;
  auVar21._12_4_ = fVar62 * fVar88;
  auVar21._16_4_ = fVar163 * 0.0;
  auVar21._20_4_ = fVar62 * 0.0;
  auVar21._24_4_ = fVar163 * 0.0;
  auVar21._28_4_ = fStack_5c4;
  auVar9 = vfmadd231ps_fma(auVar21,auVar83,local_720);
  fVar163 = auVar282._0_4_;
  auVar22._4_4_ = fVar90 * fVar91;
  auVar22._0_4_ = fVar163 * fVar89;
  auVar22._8_4_ = fVar163 * fVar123;
  auVar22._12_4_ = fVar90 * fVar88;
  auVar22._16_4_ = fVar163 * 0.0;
  auVar22._20_4_ = fVar90 * 0.0;
  auVar22._24_4_ = fVar163 * 0.0;
  auVar22._28_4_ = 0;
  auVar282 = vfmadd231ps_fma(auVar22,auVar83,_local_780);
  fVar90 = auVar8._0_4_;
  fVar163 = auVar8._4_4_;
  auVar23._4_4_ = fVar163 * fVar91;
  auVar23._0_4_ = fVar90 * fVar89;
  auVar23._8_4_ = fVar90 * fVar123;
  auVar23._12_4_ = fVar163 * fVar88;
  auVar23._16_4_ = fVar90 * 0.0;
  auVar23._20_4_ = fVar163 * 0.0;
  auVar23._24_4_ = fVar90 * 0.0;
  auVar23._28_4_ = auVar15._28_4_;
  auVar8 = vfmadd231ps_fma(auVar23,auVar83,auVar192);
  fVar90 = auVar66._0_4_;
  fVar228 = auVar66._4_4_;
  auVar24._4_4_ = fVar228 * fVar91;
  auVar24._0_4_ = fVar90 * fVar89;
  auVar24._8_4_ = fVar90 * fVar123;
  auVar24._12_4_ = fVar228 * fVar88;
  auVar24._16_4_ = fVar90 * 0.0;
  auVar24._20_4_ = fVar228 * 0.0;
  auVar24._24_4_ = fVar90 * 0.0;
  auVar24._28_4_ = fVar62;
  auVar66 = vfmadd231ps_fma(auVar24,auVar83,local_600);
  auVar16 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar213));
  fVar90 = auVar94._0_4_;
  fVar163 = auVar94._4_4_;
  auVar25._4_4_ = fVar163 * fVar91;
  auVar25._0_4_ = fVar90 * fVar89;
  auVar25._8_4_ = fVar90 * fVar123;
  auVar25._12_4_ = fVar163 * fVar88;
  auVar25._16_4_ = fVar90 * 0.0;
  auVar25._20_4_ = fVar163 * 0.0;
  auVar25._24_4_ = fVar90 * 0.0;
  auVar25._28_4_ = fVar163;
  auVar94 = vfmadd231ps_fma(auVar25,auVar83,auVar179);
  auVar17 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar75));
  fVar90 = auVar252._0_4_;
  fVar163 = auVar252._4_4_;
  auVar26._4_4_ = fVar163 * fVar91;
  auVar26._0_4_ = fVar90 * fVar89;
  auVar26._8_4_ = fVar90 * fVar123;
  auVar26._12_4_ = fVar163 * fVar88;
  auVar26._16_4_ = fVar90 * 0.0;
  auVar26._20_4_ = fVar163 * 0.0;
  auVar26._24_4_ = fVar90 * 0.0;
  auVar26._28_4_ = fVar163;
  auVar252 = vfmadd231ps_fma(auVar26,auVar83,auVar286);
  auVar27._28_4_ = fVar228;
  auVar27._0_28_ =
       ZEXT1628(CONCAT412(auVar8._12_4_ * fVar88,
                          CONCAT48(auVar8._8_4_ * fVar123,
                                   CONCAT44(auVar8._4_4_ * fVar91,auVar8._0_4_ * fVar89))));
  auVar9 = vfmadd231ps_fma(auVar27,auVar83,ZEXT1632(auVar9));
  auVar282 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar88 * auVar66._12_4_,
                                                CONCAT48(fVar123 * auVar66._8_4_,
                                                         CONCAT44(fVar91 * auVar66._4_4_,
                                                                  fVar89 * auVar66._0_4_)))),auVar83
                             ,ZEXT1632(auVar282));
  auVar110._0_4_ = auVar213._0_4_ + auVar259._0_4_;
  auVar110._4_4_ = auVar213._4_4_ + auVar259._4_4_;
  auVar110._8_4_ = auVar213._8_4_ + auVar259._8_4_;
  auVar110._12_4_ = auVar213._12_4_ + auVar259._12_4_;
  auVar110._16_4_ = auVar259._16_4_ + 0.0;
  auVar110._20_4_ = auVar259._20_4_ + 0.0;
  auVar110._24_4_ = auVar259._24_4_ + 0.0;
  auVar110._28_4_ = 0;
  auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar94._12_4_ * fVar88,
                                              CONCAT48(auVar94._8_4_ * fVar123,
                                                       CONCAT44(auVar94._4_4_ * fVar91,
                                                                auVar94._0_4_ * fVar89)))),auVar83,
                           ZEXT1632(auVar8));
  auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar252._12_4_ * fVar88,
                                               CONCAT48(auVar252._8_4_ * fVar123,
                                                        CONCAT44(auVar252._4_4_ * fVar91,
                                                                 auVar252._0_4_ * fVar89)))),auVar83
                            ,ZEXT1632(auVar66));
  auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar88 * auVar8._12_4_,
                                               CONCAT48(fVar123 * auVar8._8_4_,
                                                        CONCAT44(fVar91 * auVar8._4_4_,
                                                                 fVar89 * auVar8._0_4_)))),auVar83,
                            ZEXT1632(auVar9));
  auVar252 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar66._12_4_ * fVar88,
                                                CONCAT48(auVar66._8_4_ * fVar123,
                                                         CONCAT44(auVar66._4_4_ * fVar91,
                                                                  auVar66._0_4_ * fVar89)))),
                             ZEXT1632(auVar282),auVar83);
  auVar83 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar15 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar282));
  auVar279._0_4_ = fStack_228 * auVar83._0_4_ * 3.0;
  auVar279._4_4_ = fStack_228 * auVar83._4_4_ * 3.0;
  auVar279._8_4_ = fStack_228 * auVar83._8_4_ * 3.0;
  auVar279._12_4_ = fStack_228 * auVar83._12_4_ * 3.0;
  auVar279._16_4_ = fStack_228 * auVar83._16_4_ * 3.0;
  auVar279._20_4_ = fStack_228 * auVar83._20_4_ * 3.0;
  auVar279._24_4_ = fStack_228 * auVar83._24_4_ * 3.0;
  auVar279._28_4_ = 0;
  local_240 = fStack_228 * auVar15._0_4_ * 3.0;
  fStack_23c = fStack_228 * auVar15._4_4_ * 3.0;
  auVar28._4_4_ = fStack_23c;
  auVar28._0_4_ = local_240;
  fStack_238 = fStack_228 * auVar15._8_4_ * 3.0;
  auVar28._8_4_ = fStack_238;
  fStack_234 = fStack_228 * auVar15._12_4_ * 3.0;
  auVar28._12_4_ = fStack_234;
  fStack_230 = fStack_228 * auVar15._16_4_ * 3.0;
  auVar28._16_4_ = fStack_230;
  fStack_22c = fStack_228 * auVar15._20_4_ * 3.0;
  auVar28._20_4_ = fStack_22c;
  fStack_228 = fStack_228 * auVar15._24_4_ * 3.0;
  auVar28._24_4_ = fStack_228;
  auVar28._28_4_ = 0x40400000;
  auVar18 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar94));
  local_4a0 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar252));
  auVar83 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar213));
  auVar15 = vsubps_avx(ZEXT1632(auVar252),ZEXT1632(auVar75));
  auVar84 = vsubps_avx(auVar18,auVar16);
  fVar262 = auVar83._0_4_ + auVar84._0_4_;
  fVar263 = auVar83._4_4_ + auVar84._4_4_;
  fVar194 = auVar83._8_4_ + auVar84._8_4_;
  fVar195 = auVar83._12_4_ + auVar84._12_4_;
  fVar196 = auVar83._16_4_ + auVar84._16_4_;
  fVar197 = auVar83._20_4_ + auVar84._20_4_;
  fVar198 = auVar83._24_4_ + auVar84._24_4_;
  auVar14 = vsubps_avx(local_4a0,auVar17);
  auVar85._0_4_ = auVar15._0_4_ + auVar14._0_4_;
  auVar85._4_4_ = auVar15._4_4_ + auVar14._4_4_;
  auVar85._8_4_ = auVar15._8_4_ + auVar14._8_4_;
  auVar85._12_4_ = auVar15._12_4_ + auVar14._12_4_;
  auVar85._16_4_ = auVar15._16_4_ + auVar14._16_4_;
  auVar85._20_4_ = auVar15._20_4_ + auVar14._20_4_;
  auVar85._24_4_ = auVar15._24_4_ + auVar14._24_4_;
  auVar85._28_4_ = auVar15._28_4_ + auVar14._28_4_;
  local_1e0 = ZEXT1632(auVar75);
  fVar89 = auVar75._0_4_;
  local_260 = (float)local_5e0._0_4_ + fVar89;
  fVar91 = auVar75._4_4_;
  fStack_25c = (float)local_5e0._4_4_ + fVar91;
  fVar123 = auVar75._8_4_;
  fStack_258 = fStack_5d8 + fVar123;
  fVar88 = auVar75._12_4_;
  fStack_254 = fStack_5d4 + fVar88;
  fStack_250 = fStack_5d0 + 0.0;
  fStack_24c = fStack_5cc + 0.0;
  fStack_248 = fStack_5c8 + 0.0;
  local_4c0 = ZEXT1632(auVar213);
  auVar15 = vsubps_avx(local_4c0,auVar259);
  local_1c0 = vpermps_avx2(_DAT_01fec480,auVar15);
  auVar15 = vsubps_avx(local_1e0,_local_5e0);
  local_280 = vpermps_avx2(_DAT_01fec480,auVar15);
  local_200._0_4_ = auVar94._0_4_ + auVar279._0_4_;
  local_200._4_4_ = auVar94._4_4_ + auVar279._4_4_;
  local_200._8_4_ = auVar94._8_4_ + auVar279._8_4_;
  local_200._12_4_ = auVar94._12_4_ + auVar279._12_4_;
  local_200._16_4_ = auVar279._16_4_ + 0.0;
  local_200._20_4_ = auVar279._20_4_ + 0.0;
  local_200._24_4_ = auVar279._24_4_ + 0.0;
  local_200._28_4_ = 0;
  auVar226 = ZEXT3264(local_200);
  auVar260 = ZEXT1632(auVar94);
  auVar15 = vsubps_avx(auVar260,auVar279);
  auVar19 = vpermps_avx2(_DAT_01fec480,auVar15);
  fVar90 = auVar252._0_4_;
  local_240 = fVar90 + local_240;
  fVar163 = auVar252._4_4_;
  fStack_23c = fVar163 + fStack_23c;
  fVar62 = auVar252._8_4_;
  fStack_238 = fVar62 + fStack_238;
  fVar228 = auVar252._12_4_;
  fStack_234 = fVar228 + fStack_234;
  fStack_230 = fStack_230 + 0.0;
  fStack_22c = fStack_22c + 0.0;
  fStack_228 = fStack_228 + 0.0;
  auVar15 = vsubps_avx(ZEXT1632(auVar252),auVar28);
  local_220 = vpermps_avx2(_DAT_01fec480,auVar15);
  auVar29._4_4_ = fVar91 * fVar263;
  auVar29._0_4_ = fVar89 * fVar262;
  auVar29._8_4_ = fVar123 * fVar194;
  auVar29._12_4_ = fVar88 * fVar195;
  auVar29._16_4_ = fVar196 * 0.0;
  auVar29._20_4_ = fVar197 * 0.0;
  auVar29._24_4_ = fVar198 * 0.0;
  auVar29._28_4_ = auVar15._28_4_;
  auVar8 = vfnmadd231ps_fma(auVar29,local_4c0,auVar85);
  fStack_244 = fStack_5c4 + 0.0;
  auVar30._4_4_ = fStack_25c * fVar263;
  auVar30._0_4_ = local_260 * fVar262;
  auVar30._8_4_ = fStack_258 * fVar194;
  auVar30._12_4_ = fStack_254 * fVar195;
  auVar30._16_4_ = fStack_250 * fVar196;
  auVar30._20_4_ = fStack_24c * fVar197;
  auVar30._24_4_ = fStack_248 * fVar198;
  auVar30._28_4_ = 0;
  auVar9 = vfnmadd231ps_fma(auVar30,auVar85,auVar110);
  auVar31._4_4_ = local_280._4_4_ * fVar263;
  auVar31._0_4_ = local_280._0_4_ * fVar262;
  auVar31._8_4_ = local_280._8_4_ * fVar194;
  auVar31._12_4_ = local_280._12_4_ * fVar195;
  auVar31._16_4_ = local_280._16_4_ * fVar196;
  auVar31._20_4_ = local_280._20_4_ * fVar197;
  auVar31._24_4_ = local_280._24_4_ * fVar198;
  auVar31._28_4_ = fStack_5c4 + 0.0;
  auVar282 = vfnmadd231ps_fma(auVar31,local_1c0,auVar85);
  local_780._0_4_ = auVar17._0_4_;
  local_780._4_4_ = auVar17._4_4_;
  uStack_778._0_4_ = auVar17._8_4_;
  uStack_778._4_4_ = auVar17._12_4_;
  uStack_770._0_4_ = auVar17._16_4_;
  uStack_770._4_4_ = auVar17._20_4_;
  uStack_768._0_4_ = auVar17._24_4_;
  uStack_768._4_4_ = auVar17._28_4_;
  auVar32._4_4_ = (float)local_780._4_4_ * fVar263;
  auVar32._0_4_ = (float)local_780._0_4_ * fVar262;
  auVar32._8_4_ = (float)uStack_778 * fVar194;
  auVar32._12_4_ = uStack_778._4_4_ * fVar195;
  auVar32._16_4_ = (float)uStack_770 * fVar196;
  auVar32._20_4_ = uStack_770._4_4_ * fVar197;
  auVar32._24_4_ = (float)uStack_768 * fVar198;
  auVar32._28_4_ = uStack_768._4_4_;
  auVar66 = vfnmadd231ps_fma(auVar32,auVar16,auVar85);
  auVar210._0_4_ = fVar90 * fVar262;
  auVar210._4_4_ = fVar163 * fVar263;
  auVar210._8_4_ = fVar62 * fVar194;
  auVar210._12_4_ = fVar228 * fVar195;
  auVar210._16_4_ = fVar196 * 0.0;
  auVar210._20_4_ = fVar197 * 0.0;
  auVar210._24_4_ = fVar198 * 0.0;
  auVar210._28_4_ = 0;
  auVar94 = vfnmadd231ps_fma(auVar210,auVar260,auVar85);
  uStack_224 = 0x40400000;
  auVar33._4_4_ = fStack_23c * fVar263;
  auVar33._0_4_ = local_240 * fVar262;
  auVar33._8_4_ = fStack_238 * fVar194;
  auVar33._12_4_ = fStack_234 * fVar195;
  auVar33._16_4_ = fStack_230 * fVar196;
  auVar33._20_4_ = fStack_22c * fVar197;
  auVar33._24_4_ = fStack_228 * fVar198;
  auVar33._28_4_ = auVar16._28_4_;
  auVar75 = vfnmadd231ps_fma(auVar33,local_200,auVar85);
  auVar34._4_4_ = local_220._4_4_ * fVar263;
  auVar34._0_4_ = local_220._0_4_ * fVar262;
  auVar34._8_4_ = local_220._8_4_ * fVar194;
  auVar34._12_4_ = local_220._12_4_ * fVar195;
  auVar34._16_4_ = local_220._16_4_ * fVar196;
  auVar34._20_4_ = local_220._20_4_ * fVar197;
  auVar34._24_4_ = local_220._24_4_ * fVar198;
  auVar34._28_4_ = local_220._28_4_;
  auVar183 = vfnmadd231ps_fma(auVar34,auVar19,auVar85);
  auVar35._4_4_ = local_4a0._4_4_ * fVar263;
  auVar35._0_4_ = local_4a0._0_4_ * fVar262;
  auVar35._8_4_ = local_4a0._8_4_ * fVar194;
  auVar35._12_4_ = local_4a0._12_4_ * fVar195;
  auVar35._16_4_ = local_4a0._16_4_ * fVar196;
  auVar35._20_4_ = local_4a0._20_4_ * fVar197;
  auVar35._24_4_ = local_4a0._24_4_ * fVar198;
  auVar35._28_4_ = auVar83._28_4_ + auVar84._28_4_;
  auVar243 = vfnmadd231ps_fma(auVar35,auVar18,auVar85);
  auVar15 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar83 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar84 = vminps_avx(ZEXT1632(auVar282),ZEXT1632(auVar66));
  auVar84 = vminps_avx(auVar15,auVar84);
  auVar15 = vmaxps_avx(ZEXT1632(auVar282),ZEXT1632(auVar66));
  auVar83 = vmaxps_avx(auVar83,auVar15);
  auVar14 = vminps_avx(ZEXT1632(auVar94),ZEXT1632(auVar75));
  auVar15 = vmaxps_avx(ZEXT1632(auVar94),ZEXT1632(auVar75));
  auVar10 = vminps_avx(ZEXT1632(auVar183),ZEXT1632(auVar243));
  auVar14 = vminps_avx(auVar14,auVar10);
  auVar14 = vminps_avx(auVar84,auVar14);
  auVar84 = vmaxps_avx(ZEXT1632(auVar183),ZEXT1632(auVar243));
  auVar15 = vmaxps_avx(auVar15,auVar84);
  auVar15 = vmaxps_avx(auVar83,auVar15);
  auVar46._4_4_ = fStack_33c;
  auVar46._0_4_ = local_340;
  auVar46._8_4_ = fStack_338;
  auVar46._12_4_ = fStack_334;
  auVar46._16_4_ = fStack_330;
  auVar46._20_4_ = fStack_32c;
  auVar46._24_4_ = fStack_328;
  auVar46._28_4_ = fStack_324;
  auVar83 = vcmpps_avx(auVar14,auVar46,2);
  auVar44._4_4_ = fStack_35c;
  auVar44._0_4_ = local_360;
  auVar44._8_4_ = fStack_358;
  auVar44._12_4_ = fStack_354;
  auVar44._16_4_ = fStack_350;
  auVar44._20_4_ = fStack_34c;
  auVar44._24_4_ = fStack_348;
  auVar44._28_4_ = fStack_344;
  auVar15 = vcmpps_avx(auVar15,auVar44,5);
  auVar83 = vandps_avx(auVar15,auVar83);
  auVar15 = local_2a0 & auVar83;
  if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0x7f,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar15 >> 0xbf,0) != '\0') ||
      (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0') {
    auVar15 = vsubps_avx(auVar16,local_4c0);
    auVar84 = vsubps_avx(auVar18,auVar260);
    fVar263 = auVar15._0_4_ + auVar84._0_4_;
    fVar194 = auVar15._4_4_ + auVar84._4_4_;
    fVar195 = auVar15._8_4_ + auVar84._8_4_;
    fVar196 = auVar15._12_4_ + auVar84._12_4_;
    fVar197 = auVar15._16_4_ + auVar84._16_4_;
    fVar198 = auVar15._20_4_ + auVar84._20_4_;
    fVar92 = auVar15._24_4_ + auVar84._24_4_;
    auVar14 = vsubps_avx(auVar17,local_1e0);
    auVar10 = vsubps_avx(local_4a0,ZEXT1632(auVar252));
    auVar111._0_4_ = auVar14._0_4_ + auVar10._0_4_;
    auVar111._4_4_ = auVar14._4_4_ + auVar10._4_4_;
    auVar111._8_4_ = auVar14._8_4_ + auVar10._8_4_;
    auVar111._12_4_ = auVar14._12_4_ + auVar10._12_4_;
    auVar111._16_4_ = auVar14._16_4_ + auVar10._16_4_;
    auVar111._20_4_ = auVar14._20_4_ + auVar10._20_4_;
    auVar111._24_4_ = auVar14._24_4_ + auVar10._24_4_;
    fVar262 = auVar10._28_4_;
    auVar111._28_4_ = auVar14._28_4_ + fVar262;
    auVar36._4_4_ = fVar91 * fVar194;
    auVar36._0_4_ = fVar89 * fVar263;
    auVar36._8_4_ = fVar123 * fVar195;
    auVar36._12_4_ = fVar88 * fVar196;
    auVar36._16_4_ = fVar197 * 0.0;
    auVar36._20_4_ = fVar198 * 0.0;
    auVar36._24_4_ = fVar92 * 0.0;
    auVar36._28_4_ = auVar18._28_4_;
    auVar94 = vfnmadd231ps_fma(auVar36,auVar111,local_4c0);
    auVar37._4_4_ = fVar194 * fStack_25c;
    auVar37._0_4_ = fVar263 * local_260;
    auVar37._8_4_ = fVar195 * fStack_258;
    auVar37._12_4_ = fVar196 * fStack_254;
    auVar37._16_4_ = fVar197 * fStack_250;
    auVar37._20_4_ = fVar198 * fStack_24c;
    auVar37._24_4_ = fVar92 * fStack_248;
    auVar37._28_4_ = 0;
    auVar8 = vfnmadd213ps_fma(auVar110,auVar111,auVar37);
    auVar38._4_4_ = fVar194 * local_280._4_4_;
    auVar38._0_4_ = fVar263 * local_280._0_4_;
    auVar38._8_4_ = fVar195 * local_280._8_4_;
    auVar38._12_4_ = fVar196 * local_280._12_4_;
    auVar38._16_4_ = fVar197 * local_280._16_4_;
    auVar38._20_4_ = fVar198 * local_280._20_4_;
    auVar38._24_4_ = fVar92 * local_280._24_4_;
    auVar38._28_4_ = 0;
    auVar9 = vfnmadd213ps_fma(local_1c0,auVar111,auVar38);
    auVar39._4_4_ = (float)local_780._4_4_ * fVar194;
    auVar39._0_4_ = (float)local_780._0_4_ * fVar263;
    auVar39._8_4_ = (float)uStack_778 * fVar195;
    auVar39._12_4_ = uStack_778._4_4_ * fVar196;
    auVar39._16_4_ = (float)uStack_770 * fVar197;
    auVar39._20_4_ = uStack_770._4_4_ * fVar198;
    auVar39._24_4_ = (float)uStack_768 * fVar92;
    auVar39._28_4_ = 0;
    auVar252 = vfnmadd231ps_fma(auVar39,auVar111,auVar16);
    auVar135._0_4_ = fVar90 * fVar263;
    auVar135._4_4_ = fVar163 * fVar194;
    auVar135._8_4_ = fVar62 * fVar195;
    auVar135._12_4_ = fVar228 * fVar196;
    auVar135._16_4_ = fVar197 * 0.0;
    auVar135._20_4_ = fVar198 * 0.0;
    auVar135._24_4_ = fVar92 * 0.0;
    auVar135._28_4_ = 0;
    auVar75 = vfnmadd231ps_fma(auVar135,auVar111,auVar260);
    auVar40._4_4_ = fVar194 * fStack_23c;
    auVar40._0_4_ = fVar263 * local_240;
    auVar40._8_4_ = fVar195 * fStack_238;
    auVar40._12_4_ = fVar196 * fStack_234;
    auVar40._16_4_ = fVar197 * fStack_230;
    auVar40._20_4_ = fVar198 * fStack_22c;
    auVar40._24_4_ = fVar92 * fStack_228;
    auVar40._28_4_ = fVar262;
    auVar282 = vfnmadd213ps_fma(local_200,auVar111,auVar40);
    auVar41._4_4_ = fVar194 * local_220._4_4_;
    auVar41._0_4_ = fVar263 * local_220._0_4_;
    auVar41._8_4_ = fVar195 * local_220._8_4_;
    auVar41._12_4_ = fVar196 * local_220._12_4_;
    auVar41._16_4_ = fVar197 * local_220._16_4_;
    auVar41._20_4_ = fVar198 * local_220._20_4_;
    auVar41._24_4_ = fVar92 * local_220._24_4_;
    auVar41._28_4_ = fVar262;
    auVar66 = vfnmadd213ps_fma(auVar19,auVar111,auVar41);
    auVar226 = ZEXT1664(auVar66);
    auVar42._4_4_ = local_4a0._4_4_ * fVar194;
    auVar42._0_4_ = local_4a0._0_4_ * fVar263;
    auVar42._8_4_ = local_4a0._8_4_ * fVar195;
    auVar42._12_4_ = local_4a0._12_4_ * fVar196;
    auVar42._16_4_ = local_4a0._16_4_ * fVar197;
    auVar42._20_4_ = local_4a0._20_4_ * fVar198;
    auVar42._24_4_ = local_4a0._24_4_ * fVar92;
    auVar42._28_4_ = auVar15._28_4_ + auVar84._28_4_;
    auVar183 = vfnmadd231ps_fma(auVar42,auVar18,auVar111);
    auVar84 = vminps_avx(ZEXT1632(auVar94),ZEXT1632(auVar8));
    auVar15 = vmaxps_avx(ZEXT1632(auVar94),ZEXT1632(auVar8));
    auVar14 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar252));
    auVar14 = vminps_avx(auVar84,auVar14);
    auVar84 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar252));
    auVar15 = vmaxps_avx(auVar15,auVar84);
    auVar10 = vminps_avx(ZEXT1632(auVar75),ZEXT1632(auVar282));
    auVar84 = vmaxps_avx(ZEXT1632(auVar75),ZEXT1632(auVar282));
    auVar16 = vminps_avx(ZEXT1632(auVar66),ZEXT1632(auVar183));
    auVar10 = vminps_avx(auVar10,auVar16);
    auVar10 = vminps_avx(auVar14,auVar10);
    auVar14 = vmaxps_avx(ZEXT1632(auVar66),ZEXT1632(auVar183));
    auVar84 = vmaxps_avx(auVar84,auVar14);
    auVar84 = vmaxps_avx(auVar15,auVar84);
    auVar47._4_4_ = fStack_33c;
    auVar47._0_4_ = local_340;
    auVar47._8_4_ = fStack_338;
    auVar47._12_4_ = fStack_334;
    auVar47._16_4_ = fStack_330;
    auVar47._20_4_ = fStack_32c;
    auVar47._24_4_ = fStack_328;
    auVar47._28_4_ = fStack_324;
    auVar15 = vcmpps_avx(auVar10,auVar47,2);
    auVar45._4_4_ = fStack_35c;
    auVar45._0_4_ = local_360;
    auVar45._8_4_ = fStack_358;
    auVar45._12_4_ = fStack_354;
    auVar45._16_4_ = fStack_350;
    auVar45._20_4_ = fStack_34c;
    auVar45._24_4_ = fStack_348;
    auVar45._28_4_ = fStack_344;
    auVar84 = vcmpps_avx(auVar84,auVar45,5);
    auVar15 = vandps_avx(auVar84,auVar15);
    auVar83 = vandps_avx(local_2a0,auVar83);
    auVar84 = auVar83 & auVar15;
    if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar84 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar84 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar84 >> 0x7f,0) != '\0') ||
          (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar84 >> 0xbf,0) != '\0') ||
        (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar84[0x1f] < '\0')
    {
      auVar83 = vandps_avx(auVar15,auVar83);
      uVar54 = vmovmskps_avx(auVar83);
      if (uVar54 != 0) {
        auStack_500[uVar50] = uVar54 & 0xff;
        uVar93 = vmovlps_avx(local_410);
        *(undefined8 *)(&uStack_320 + uVar50 * 2) = uVar93;
        uVar58 = vmovlps_avx(auVar70);
        auStack_1a0[uVar50] = uVar58;
        uVar50 = (ulong)((int)uVar50 + 1);
      }
    }
  }
LAB_015d80f6:
  if ((int)uVar50 != 0) {
    uVar55 = (int)uVar50 - 1;
    uVar56 = (ulong)uVar55;
    uVar52 = auStack_500[uVar56];
    uVar54 = (&uStack_320)[uVar56 * 2];
    fVar89 = afStack_31c[uVar56 * 2];
    iVar49 = 0;
    for (uVar58 = (ulong)uVar52; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      iVar49 = iVar49 + 1;
    }
    uVar52 = uVar52 - 1 & uVar52;
    if (uVar52 == 0) {
      uVar50 = (ulong)uVar55;
    }
    auVar70._8_8_ = 0;
    auVar70._0_8_ = auStack_1a0[uVar56];
    auStack_500[uVar56] = uVar52;
    fVar91 = (float)(iVar49 + 1) * 0.14285715;
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar89 * (float)iVar49 * 0.14285715)),ZEXT416(uVar54),
                             ZEXT416((uint)(1.0 - (float)iVar49 * 0.14285715)));
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar89 * fVar91)),ZEXT416(uVar54),
                             ZEXT416((uint)(1.0 - fVar91)));
    fVar91 = auVar9._0_4_;
    auVar193._0_4_ = auVar8._0_4_;
    fVar89 = fVar91 - auVar193._0_4_;
    if (fVar89 < 0.16666667) {
      auVar282 = vshufps_avx(auVar70,auVar70,0x50);
      auVar101._8_4_ = 0x3f800000;
      auVar101._0_8_ = 0x3f8000003f800000;
      auVar101._12_4_ = 0x3f800000;
      auVar66 = vsubps_avx(auVar101,auVar282);
      fVar123 = auVar282._0_4_;
      auVar141._0_4_ = fVar123 * fVar137;
      fVar88 = auVar282._4_4_;
      auVar141._4_4_ = fVar88 * fVar146;
      fVar90 = auVar282._8_4_;
      auVar141._8_4_ = fVar90 * fVar137;
      fVar163 = auVar282._12_4_;
      auVar141._12_4_ = fVar163 * fVar146;
      auVar152._0_4_ = fVar123 * fVar247;
      auVar152._4_4_ = fVar88 * fVar261;
      auVar152._8_4_ = fVar90 * fVar247;
      auVar152._12_4_ = fVar163 * fVar261;
      auVar176._0_4_ = fVar123 * fVar199;
      auVar176._4_4_ = fVar88 * fVar211;
      auVar176._8_4_ = fVar90 * fVar199;
      auVar176._12_4_ = fVar163 * fVar211;
      auVar72._0_4_ = fVar123 * fVar212;
      auVar72._4_4_ = fVar88 * fVar227;
      auVar72._8_4_ = fVar90 * fVar212;
      auVar72._12_4_ = fVar163 * fVar227;
      auVar282 = vfmadd231ps_fma(auVar141,auVar66,auVar186);
      auVar94 = vfmadd231ps_fma(auVar152,auVar66,auVar231);
      auVar252 = vfmadd231ps_fma(auVar176,auVar66,auVar251);
      auVar66 = vfmadd231ps_fma(auVar72,auVar66,auVar265);
      auVar136._16_16_ = auVar282;
      auVar136._0_16_ = auVar282;
      auVar145._16_16_ = auVar94;
      auVar145._0_16_ = auVar94;
      auVar161._16_16_ = auVar252;
      auVar161._0_16_ = auVar252;
      auVar193._4_4_ = auVar193._0_4_;
      auVar193._8_4_ = auVar193._0_4_;
      auVar193._12_4_ = auVar193._0_4_;
      auVar193._20_4_ = fVar91;
      auVar193._16_4_ = fVar91;
      auVar193._24_4_ = fVar91;
      auVar193._28_4_ = fVar91;
      auVar83 = vsubps_avx(auVar145,auVar136);
      auVar94 = vfmadd213ps_fma(auVar83,auVar193,auVar136);
      auVar83 = vsubps_avx(auVar161,auVar145);
      auVar75 = vfmadd213ps_fma(auVar83,auVar193,auVar145);
      auVar282 = vsubps_avx(auVar66,auVar252);
      auVar86._16_16_ = auVar282;
      auVar86._0_16_ = auVar282;
      auVar282 = vfmadd213ps_fma(auVar86,auVar193,auVar161);
      auVar83 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar94));
      auVar66 = vfmadd213ps_fma(auVar83,auVar193,ZEXT1632(auVar94));
      auVar83 = vsubps_avx(ZEXT1632(auVar282),ZEXT1632(auVar75));
      auVar282 = vfmadd213ps_fma(auVar83,auVar193,ZEXT1632(auVar75));
      auVar83 = vsubps_avx(ZEXT1632(auVar282),ZEXT1632(auVar66));
      auVar200 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar83,auVar193);
      fVar228 = auVar83._4_4_ * 3.0;
      fVar123 = fVar89 * 0.33333334;
      local_4a0._0_8_ =
           CONCAT44(auVar200._4_4_ + fVar123 * fVar228,
                    auVar200._0_4_ + fVar123 * auVar83._0_4_ * 3.0);
      local_4a0._8_4_ = auVar200._8_4_ + fVar123 * auVar83._8_4_ * 3.0;
      local_4a0._12_4_ = auVar200._12_4_ + fVar123 * auVar83._12_4_ * 3.0;
      auVar66 = vshufpd_avx(auVar200,auVar200,3);
      auVar94 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar282 = vsubps_avx(auVar66,auVar200);
      auVar252 = vsubps_avx(auVar94,(undefined1  [16])0x0);
      auVar73._0_4_ = auVar282._0_4_ + auVar252._0_4_;
      auVar73._4_4_ = auVar282._4_4_ + auVar252._4_4_;
      auVar73._8_4_ = auVar282._8_4_ + auVar252._8_4_;
      auVar73._12_4_ = auVar282._12_4_ + auVar252._12_4_;
      auVar282 = vshufps_avx(auVar200,auVar200,0xb1);
      auVar252 = vshufps_avx(local_4a0._0_16_,local_4a0._0_16_,0xb1);
      auVar275._4_4_ = auVar73._0_4_;
      auVar275._0_4_ = auVar73._0_4_;
      auVar275._8_4_ = auVar73._0_4_;
      auVar275._12_4_ = auVar73._0_4_;
      auVar75 = vshufps_avx(auVar73,auVar73,0x55);
      fVar88 = auVar75._0_4_;
      auVar74._0_4_ = fVar88 * auVar282._0_4_;
      fVar90 = auVar75._4_4_;
      auVar74._4_4_ = fVar90 * auVar282._4_4_;
      fVar163 = auVar75._8_4_;
      auVar74._8_4_ = fVar163 * auVar282._8_4_;
      fVar62 = auVar75._12_4_;
      auVar74._12_4_ = fVar62 * auVar282._12_4_;
      auVar153._0_4_ = fVar88 * auVar252._0_4_;
      auVar153._4_4_ = fVar90 * auVar252._4_4_;
      auVar153._8_4_ = fVar163 * auVar252._8_4_;
      auVar153._12_4_ = fVar62 * auVar252._12_4_;
      auVar183 = vfmadd231ps_fma(auVar74,auVar275,auVar200);
      auVar243 = vfmadd231ps_fma(auVar153,auVar275,local_4a0._0_16_);
      auVar252 = vshufps_avx(auVar183,auVar183,0xe8);
      auVar75 = vshufps_avx(auVar243,auVar243,0xe8);
      auVar282 = vcmpps_avx(auVar252,auVar75,1);
      uVar54 = vextractps_avx(auVar282,0);
      auVar213 = auVar243;
      if ((uVar54 & 1) == 0) {
        auVar213 = auVar183;
      }
      auVar127._0_4_ = fVar123 * auVar83._16_4_ * 3.0;
      auVar127._4_4_ = fVar123 * fVar228;
      auVar127._8_4_ = fVar123 * auVar83._24_4_ * 3.0;
      auVar127._12_4_ = fVar123 * auVar226._28_4_;
      local_4c0._0_16_ = vsubps_avx((undefined1  [16])0x0,auVar127);
      auVar128 = vshufps_avx(local_4c0._0_16_,local_4c0._0_16_,0xb1);
      auVar241 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar187._0_4_ = fVar88 * auVar128._0_4_;
      auVar187._4_4_ = fVar90 * auVar128._4_4_;
      auVar187._8_4_ = fVar163 * auVar128._8_4_;
      auVar187._12_4_ = fVar62 * auVar128._12_4_;
      auVar204._0_4_ = auVar241._0_4_ * fVar88;
      auVar204._4_4_ = auVar241._4_4_ * fVar90;
      auVar204._8_4_ = auVar241._8_4_ * fVar163;
      auVar204._12_4_ = auVar241._12_4_ * fVar62;
      auVar273 = vfmadd231ps_fma(auVar187,auVar275,local_4c0._0_16_);
      auVar20 = vfmadd231ps_fma(auVar204,(undefined1  [16])0x0,auVar275);
      auVar241 = vshufps_avx(auVar273,auVar273,0xe8);
      auVar272 = vshufps_avx(auVar20,auVar20,0xe8);
      auVar226 = ZEXT1664(auVar272);
      auVar128 = vcmpps_avx(auVar241,auVar272,1);
      uVar54 = vextractps_avx(auVar128,0);
      auVar232 = auVar20;
      if ((uVar54 & 1) == 0) {
        auVar232 = auVar273;
      }
      auVar213 = vmaxss_avx(auVar232,auVar213);
      auVar252 = vminps_avx(auVar252,auVar75);
      auVar75 = vminps_avx(auVar241,auVar272);
      auVar75 = vminps_avx(auVar252,auVar75);
      auVar282 = vshufps_avx(auVar282,auVar282,0x55);
      auVar282 = vblendps_avx(auVar282,auVar128,2);
      auVar128 = vpslld_avx(auVar282,0x1f);
      auVar282 = vshufpd_avx(auVar243,auVar243,1);
      auVar282 = vinsertps_avx(auVar282,auVar20,0x9c);
      auVar252 = vshufpd_avx(auVar183,auVar183,1);
      auVar252 = vinsertps_avx(auVar252,auVar273,0x9c);
      auVar282 = vblendvps_avx(auVar252,auVar282,auVar128);
      auVar252 = vmovshdup_avx(auVar282);
      auVar282 = vmaxss_avx(auVar252,auVar282);
      fVar163 = auVar75._0_4_;
      auVar252 = vmovshdup_avx(auVar75);
      fVar90 = auVar282._0_4_;
      fVar123 = auVar252._0_4_;
      fVar88 = auVar213._0_4_;
      if (((0.0001 <= fVar163) || (fVar90 <= -0.0001)) && (0.0001 <= fVar123 || fVar90 <= -0.0001))
      goto code_r0x015d8413;
      goto LAB_015d843a;
    }
    local_410 = vinsertps_avx(auVar8,auVar9,0x10);
    goto LAB_015d7b3e;
  }
  if (bVar59) {
    return bVar59;
  }
  uVar61 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar82._4_4_ = uVar61;
  auVar82._0_4_ = uVar61;
  auVar82._8_4_ = uVar61;
  auVar82._12_4_ = uVar61;
  auVar8 = vcmpps_avx(local_420,auVar82,2);
  uVar48 = vmovmskps_avx(auVar8);
  uVar48 = (uint)uVar57 & uVar48;
  if (uVar48 == 0) {
    return bVar59;
  }
  goto LAB_015d732d;
code_r0x015d8413:
  auVar252 = vcmpps_avx(auVar252,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar183 = vcmpps_avx(auVar75,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar252 = vandps_avx(auVar183,auVar252);
  if (fVar88 <= -0.0001 || (auVar252 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_015d80f6;
LAB_015d843a:
  auVar183 = vcmpps_avx(auVar75,_DAT_01f7aa10,1);
  auVar243 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar252 = vcmpss_avx(auVar213,ZEXT816(0) << 0x20,1);
  auVar117._8_4_ = 0xbf800000;
  auVar117._0_8_ = 0xbf800000bf800000;
  auVar117._12_4_ = 0xbf800000;
  auVar252 = vblendvps_avx(auVar101,auVar117,auVar252);
  auVar183 = vblendvps_avx(auVar101,auVar117,auVar183);
  fVar228 = auVar183._0_4_;
  fVar62 = auVar252._0_4_;
  auVar252 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar228 == fVar62) && (!NAN(fVar228) && !NAN(fVar62))) {
    auVar252 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar228 == fVar62) && (!NAN(fVar228) && !NAN(fVar62))) {
    auVar243 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar183 = vmovshdup_avx(auVar183);
  fVar262 = auVar183._0_4_;
  if ((fVar228 != fVar262) || (NAN(fVar228) || NAN(fVar262))) {
    auVar188._12_4_ = 0;
    auVar188._0_12_ = ZEXT812(0);
    auVar188 = auVar188 << 0x20;
    if ((fVar123 != fVar163) || (NAN(fVar123) || NAN(fVar163))) {
      auVar129._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
      auVar129._8_4_ = auVar75._8_4_ ^ 0x80000000;
      auVar129._12_4_ = auVar75._12_4_ ^ 0x80000000;
      auVar130._0_4_ = -fVar163 / (fVar123 - fVar163);
      auVar130._4_12_ = auVar129._4_12_;
      auVar75 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar130._0_4_)),auVar188,auVar130);
      auVar183 = auVar75;
    }
    else {
      auVar75 = ZEXT816(0) << 0x20;
      if ((fVar163 != 0.0) || (auVar183 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar163))) {
        auVar75 = SUB6416(ZEXT464(0x7f800000),0);
        auVar183 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar252 = vminss_avx(auVar252,auVar75);
    auVar243 = vmaxss_avx(auVar183,auVar243);
  }
  else {
    auVar43._12_4_ = 0;
    auVar43._0_12_ = ZEXT812(0);
    auVar188 = auVar43 << 0x20;
  }
  auVar282 = vcmpss_avx(auVar282,auVar188,1);
  auVar118._8_4_ = 0xbf800000;
  auVar118._0_8_ = 0xbf800000bf800000;
  auVar118._12_4_ = 0xbf800000;
  auVar282 = vblendvps_avx(auVar101,auVar118,auVar282);
  fVar123 = auVar282._0_4_;
  auVar282 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar62 != fVar123) || (NAN(fVar62) || NAN(fVar123))) {
    if ((fVar90 != fVar88) || (NAN(fVar90) || NAN(fVar88))) {
      auVar76._0_8_ = auVar213._0_8_ ^ 0x8000000080000000;
      auVar76._8_4_ = auVar213._8_4_ ^ 0x80000000;
      auVar76._12_4_ = auVar213._12_4_ ^ 0x80000000;
      auVar131._0_4_ = -fVar88 / (fVar90 - fVar88);
      auVar131._4_12_ = auVar76._4_12_;
      auVar75 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar131._0_4_)),auVar188,auVar131);
      auVar183 = auVar75;
    }
    else {
      auVar75 = ZEXT816(0) << 0x20;
      if ((fVar88 != 0.0) || (auVar183 = auVar282, NAN(fVar88))) {
        auVar75 = SUB6416(ZEXT464(0x7f800000),0);
        auVar183 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar252 = vminss_avx(auVar252,auVar75);
    auVar243 = vmaxss_avx(auVar183,auVar243);
  }
  if ((fVar262 != fVar123) || (NAN(fVar262) || NAN(fVar123))) {
    auVar252 = vminss_avx(auVar252,auVar282);
    auVar243 = vmaxss_avx(auVar282,auVar243);
  }
  auVar252 = vmaxss_avx(auVar188,auVar252);
  auVar75 = vminss_avx(auVar243,auVar282);
  if (auVar75._0_4_ < auVar252._0_4_) goto LAB_015d80f6;
  auVar252 = vmaxss_avx(auVar188,ZEXT416((uint)(auVar252._0_4_ + -0.1)));
  auVar282 = vminss_avx(ZEXT416((uint)(auVar75._0_4_ + 0.1)),auVar282);
  auVar142._0_8_ = auVar200._0_8_;
  auVar142._8_8_ = auVar142._0_8_;
  auVar218._8_8_ = local_4a0._0_8_;
  auVar218._0_8_ = local_4a0._0_8_;
  auVar233._8_8_ = local_4c0._0_8_;
  auVar233._0_8_ = local_4c0._0_8_;
  auVar75 = vshufpd_avx(local_4a0._0_16_,local_4a0._0_16_,3);
  auVar183 = vshufpd_avx(local_4c0._0_16_,local_4c0._0_16_,3);
  auVar243 = vshufps_avx(auVar252,auVar282,0);
  auVar200 = vsubps_avx(auVar101,auVar243);
  local_5e0._0_4_ = auVar66._0_4_;
  local_5e0._4_4_ = auVar66._4_4_;
  fStack_5d8 = auVar66._8_4_;
  fStack_5d4 = auVar66._12_4_;
  fVar123 = auVar243._0_4_;
  auVar77._0_4_ = fVar123 * (float)local_5e0._0_4_;
  fVar88 = auVar243._4_4_;
  auVar77._4_4_ = fVar88 * (float)local_5e0._4_4_;
  fVar90 = auVar243._8_4_;
  auVar77._8_4_ = fVar90 * fStack_5d8;
  fVar163 = auVar243._12_4_;
  auVar77._12_4_ = fVar163 * fStack_5d4;
  auVar177._0_4_ = fVar123 * auVar75._0_4_;
  auVar177._4_4_ = fVar88 * auVar75._4_4_;
  auVar177._8_4_ = fVar90 * auVar75._8_4_;
  auVar177._12_4_ = fVar163 * auVar75._12_4_;
  auVar189._0_4_ = fVar123 * auVar183._0_4_;
  auVar189._4_4_ = fVar88 * auVar183._4_4_;
  auVar189._8_4_ = fVar90 * auVar183._8_4_;
  auVar189._12_4_ = fVar163 * auVar183._12_4_;
  local_5c0 = auVar94._0_4_;
  fStack_5bc = auVar94._4_4_;
  fStack_5b8 = auVar94._8_4_;
  fStack_5b4 = auVar94._12_4_;
  auVar205._0_4_ = fVar123 * local_5c0;
  auVar205._4_4_ = fVar88 * fStack_5bc;
  auVar205._8_4_ = fVar90 * fStack_5b8;
  auVar205._12_4_ = fVar163 * fStack_5b4;
  auVar75 = vfmadd231ps_fma(auVar77,auVar200,auVar142);
  auVar183 = vfmadd231ps_fma(auVar177,auVar200,auVar218);
  auVar243 = vfmadd231ps_fma(auVar189,auVar200,auVar233);
  auVar200 = vfmadd231ps_fma(auVar205,auVar200,ZEXT816(0));
  auVar66 = vmovshdup_avx(auVar70);
  auVar273 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar252._0_4_)),auVar70,
                             ZEXT416((uint)(1.0 - auVar252._0_4_)));
  auVar70 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar282._0_4_)),auVar70,
                            ZEXT416((uint)(1.0 - auVar282._0_4_)));
  fVar123 = 1.0 / fVar89;
  auVar282 = vsubps_avx(auVar183,auVar75);
  auVar219._0_4_ = auVar282._0_4_ * 3.0;
  auVar219._4_4_ = auVar282._4_4_ * 3.0;
  auVar219._8_4_ = auVar282._8_4_ * 3.0;
  auVar219._12_4_ = auVar282._12_4_ * 3.0;
  auVar282 = vsubps_avx(auVar243,auVar183);
  auVar234._0_4_ = auVar282._0_4_ * 3.0;
  auVar234._4_4_ = auVar282._4_4_ * 3.0;
  auVar234._8_4_ = auVar282._8_4_ * 3.0;
  auVar234._12_4_ = auVar282._12_4_ * 3.0;
  auVar282 = vsubps_avx(auVar200,auVar243);
  auVar244._0_4_ = auVar282._0_4_ * 3.0;
  auVar244._4_4_ = auVar282._4_4_ * 3.0;
  auVar244._8_4_ = auVar282._8_4_ * 3.0;
  auVar244._12_4_ = auVar282._12_4_ * 3.0;
  auVar66 = vminps_avx(auVar234,auVar244);
  auVar282 = vmaxps_avx(auVar234,auVar244);
  auVar66 = vminps_avx(auVar219,auVar66);
  auVar282 = vmaxps_avx(auVar219,auVar282);
  auVar94 = vshufpd_avx(auVar66,auVar66,3);
  auVar252 = vshufpd_avx(auVar282,auVar282,3);
  auVar66 = vminps_avx(auVar66,auVar94);
  auVar282 = vmaxps_avx(auVar282,auVar252);
  auVar235._0_4_ = auVar66._0_4_ * fVar123;
  auVar235._4_4_ = auVar66._4_4_ * fVar123;
  auVar235._8_4_ = auVar66._8_4_ * fVar123;
  auVar235._12_4_ = auVar66._12_4_ * fVar123;
  auVar220._0_4_ = auVar282._0_4_ * fVar123;
  auVar220._4_4_ = auVar282._4_4_ * fVar123;
  auVar220._8_4_ = auVar282._8_4_ * fVar123;
  auVar220._12_4_ = auVar282._12_4_ * fVar123;
  fVar123 = 1.0 / (auVar70._0_4_ - auVar273._0_4_);
  auVar282 = vshufpd_avx(auVar75,auVar75,3);
  auVar66 = vshufpd_avx(auVar183,auVar183,3);
  auVar94 = vshufpd_avx(auVar243,auVar243,3);
  auVar252 = vshufpd_avx(auVar200,auVar200,3);
  auVar282 = vsubps_avx(auVar282,auVar75);
  auVar75 = vsubps_avx(auVar66,auVar183);
  auVar183 = vsubps_avx(auVar94,auVar243);
  auVar252 = vsubps_avx(auVar252,auVar200);
  auVar66 = vminps_avx(auVar282,auVar75);
  auVar282 = vmaxps_avx(auVar282,auVar75);
  auVar94 = vminps_avx(auVar183,auVar252);
  auVar94 = vminps_avx(auVar66,auVar94);
  auVar66 = vmaxps_avx(auVar183,auVar252);
  auVar282 = vmaxps_avx(auVar282,auVar66);
  auVar266._0_4_ = fVar123 * auVar94._0_4_;
  auVar266._4_4_ = fVar123 * auVar94._4_4_;
  auVar266._8_4_ = fVar123 * auVar94._8_4_;
  auVar266._12_4_ = fVar123 * auVar94._12_4_;
  auVar253._0_4_ = fVar123 * auVar282._0_4_;
  auVar253._4_4_ = fVar123 * auVar282._4_4_;
  auVar253._8_4_ = fVar123 * auVar282._8_4_;
  auVar253._12_4_ = fVar123 * auVar282._12_4_;
  auVar252 = vinsertps_avx(auVar8,auVar273,0x10);
  auVar75 = vinsertps_avx(auVar9,auVar70,0x10);
  auVar245._0_4_ = (auVar252._0_4_ + auVar75._0_4_) * 0.5;
  auVar245._4_4_ = (auVar252._4_4_ + auVar75._4_4_) * 0.5;
  auVar245._8_4_ = (auVar252._8_4_ + auVar75._8_4_) * 0.5;
  auVar245._12_4_ = (auVar252._12_4_ + auVar75._12_4_) * 0.5;
  auVar78._4_4_ = auVar245._0_4_;
  auVar78._0_4_ = auVar245._0_4_;
  auVar78._8_4_ = auVar245._0_4_;
  auVar78._12_4_ = auVar245._0_4_;
  auVar282 = vfmadd213ps_fma(local_370,auVar78,auVar11);
  auVar66 = vfmadd213ps_fma(local_380,auVar78,auVar12);
  auVar94 = vfmadd213ps_fma(local_390,auVar78,auVar13);
  auVar9 = vsubps_avx(auVar66,auVar282);
  auVar282 = vfmadd213ps_fma(auVar9,auVar78,auVar282);
  auVar9 = vsubps_avx(auVar94,auVar66);
  auVar9 = vfmadd213ps_fma(auVar9,auVar78,auVar66);
  auVar9 = vsubps_avx(auVar9,auVar282);
  auVar282 = vfmadd231ps_fma(auVar282,auVar9,auVar78);
  auVar79._0_8_ = CONCAT44(auVar9._4_4_ * 3.0,auVar9._0_4_ * 3.0);
  auVar79._8_4_ = auVar9._8_4_ * 3.0;
  auVar79._12_4_ = auVar9._12_4_ * 3.0;
  auVar276._8_8_ = auVar282._0_8_;
  auVar276._0_8_ = auVar282._0_8_;
  auVar9 = vshufpd_avx(auVar282,auVar282,3);
  auVar282 = vshufps_avx(auVar245,auVar245,0x55);
  auVar243 = vsubps_avx(auVar9,auVar276);
  auVar213 = vfmadd231ps_fma(auVar276,auVar282,auVar243);
  auVar283._8_8_ = auVar79._0_8_;
  auVar283._0_8_ = auVar79._0_8_;
  auVar9 = vshufpd_avx(auVar79,auVar79,3);
  auVar9 = vsubps_avx(auVar9,auVar283);
  auVar200 = vfmadd213ps_fma(auVar9,auVar282,auVar283);
  auVar282 = vmovshdup_avx(auVar200);
  auVar284._0_8_ = auVar282._0_8_ ^ 0x8000000080000000;
  auVar284._8_4_ = auVar282._8_4_ ^ 0x80000000;
  auVar284._12_4_ = auVar282._12_4_ ^ 0x80000000;
  auVar66 = vmovshdup_avx(auVar243);
  auVar9 = vunpcklps_avx(auVar66,auVar284);
  auVar94 = vshufps_avx(auVar9,auVar284,4);
  auVar183 = vshufps_avx(auVar245,auVar245,0x54);
  auVar132._0_8_ = auVar243._0_8_ ^ 0x8000000080000000;
  auVar132._8_4_ = auVar243._8_4_ ^ 0x80000000;
  auVar132._12_4_ = auVar243._12_4_ ^ 0x80000000;
  auVar9 = vmovlhps_avx(auVar132,auVar200);
  auVar9 = vshufps_avx(auVar9,auVar200,8);
  auVar282 = vfmsub231ss_fma(ZEXT416((uint)(auVar243._0_4_ * auVar282._0_4_)),auVar66,auVar200);
  uVar61 = auVar282._0_4_;
  auVar80._4_4_ = uVar61;
  auVar80._0_4_ = uVar61;
  auVar80._8_4_ = uVar61;
  auVar80._12_4_ = uVar61;
  auVar282 = vdivps_avx(auVar94,auVar80);
  auVar66 = vdivps_avx(auVar9,auVar80);
  fVar90 = auVar213._0_4_;
  fVar123 = auVar282._0_4_;
  auVar9 = vshufps_avx(auVar213,auVar213,0x55);
  fVar88 = auVar66._0_4_;
  auVar81._0_4_ = fVar90 * fVar123 + auVar9._0_4_ * fVar88;
  auVar81._4_4_ = fVar90 * auVar282._4_4_ + auVar9._4_4_ * auVar66._4_4_;
  auVar81._8_4_ = fVar90 * auVar282._8_4_ + auVar9._8_4_ * auVar66._8_4_;
  auVar81._12_4_ = fVar90 * auVar282._12_4_ + auVar9._12_4_ * auVar66._12_4_;
  auVar272 = vsubps_avx(auVar183,auVar81);
  auVar183 = vmovshdup_avx(auVar282);
  auVar9 = vinsertps_avx(auVar235,auVar266,0x1c);
  auVar154._0_4_ = auVar183._0_4_ * auVar9._0_4_;
  auVar154._4_4_ = auVar183._4_4_ * auVar9._4_4_;
  auVar154._8_4_ = auVar183._8_4_ * auVar9._8_4_;
  auVar154._12_4_ = auVar183._12_4_ * auVar9._12_4_;
  auVar94 = vinsertps_avx(auVar220,auVar253,0x1c);
  auVar102._0_4_ = auVar94._0_4_ * auVar183._0_4_;
  auVar102._4_4_ = auVar94._4_4_ * auVar183._4_4_;
  auVar102._8_4_ = auVar94._8_4_ * auVar183._8_4_;
  auVar102._12_4_ = auVar94._12_4_ * auVar183._12_4_;
  auVar213 = vminps_avx(auVar154,auVar102);
  auVar200 = vmaxps_avx(auVar102,auVar154);
  auVar183 = vinsertps_avx(auVar266,auVar235,0x4c);
  auVar128 = vmovshdup_avx(auVar66);
  auVar243 = vinsertps_avx(auVar253,auVar220,0x4c);
  auVar254._0_4_ = auVar128._0_4_ * auVar183._0_4_;
  auVar254._4_4_ = auVar128._4_4_ * auVar183._4_4_;
  auVar254._8_4_ = auVar128._8_4_ * auVar183._8_4_;
  auVar254._12_4_ = auVar128._12_4_ * auVar183._12_4_;
  auVar236._0_4_ = auVar128._0_4_ * auVar243._0_4_;
  auVar236._4_4_ = auVar128._4_4_ * auVar243._4_4_;
  auVar236._8_4_ = auVar128._8_4_ * auVar243._8_4_;
  auVar236._12_4_ = auVar128._12_4_ * auVar243._12_4_;
  auVar128 = vminps_avx(auVar254,auVar236);
  auVar267._0_4_ = auVar213._0_4_ + auVar128._0_4_;
  auVar267._4_4_ = auVar213._4_4_ + auVar128._4_4_;
  auVar267._8_4_ = auVar213._8_4_ + auVar128._8_4_;
  auVar267._12_4_ = auVar213._12_4_ + auVar128._12_4_;
  auVar213 = vmaxps_avx(auVar236,auVar254);
  auVar103._0_4_ = auVar213._0_4_ + auVar200._0_4_;
  auVar103._4_4_ = auVar213._4_4_ + auVar200._4_4_;
  auVar103._8_4_ = auVar213._8_4_ + auVar200._8_4_;
  auVar103._12_4_ = auVar213._12_4_ + auVar200._12_4_;
  auVar237._8_8_ = 0x3f80000000000000;
  auVar237._0_8_ = 0x3f80000000000000;
  auVar200 = vsubps_avx(auVar237,auVar103);
  auVar213 = vsubps_avx(auVar237,auVar267);
  auVar128 = vsubps_avx(auVar252,auVar245);
  auVar241 = vsubps_avx(auVar75,auVar245);
  auVar119._0_4_ = fVar123 * auVar9._0_4_;
  auVar119._4_4_ = fVar123 * auVar9._4_4_;
  auVar119._8_4_ = fVar123 * auVar9._8_4_;
  auVar119._12_4_ = fVar123 * auVar9._12_4_;
  auVar268._0_4_ = fVar123 * auVar94._0_4_;
  auVar268._4_4_ = fVar123 * auVar94._4_4_;
  auVar268._8_4_ = fVar123 * auVar94._8_4_;
  auVar268._12_4_ = fVar123 * auVar94._12_4_;
  auVar94 = vminps_avx(auVar119,auVar268);
  auVar9 = vmaxps_avx(auVar268,auVar119);
  auVar155._0_4_ = fVar88 * auVar183._0_4_;
  auVar155._4_4_ = fVar88 * auVar183._4_4_;
  auVar155._8_4_ = fVar88 * auVar183._8_4_;
  auVar155._12_4_ = fVar88 * auVar183._12_4_;
  auVar221._0_4_ = fVar88 * auVar243._0_4_;
  auVar221._4_4_ = fVar88 * auVar243._4_4_;
  auVar221._8_4_ = fVar88 * auVar243._8_4_;
  auVar221._12_4_ = fVar88 * auVar243._12_4_;
  auVar183 = vminps_avx(auVar155,auVar221);
  auVar269._0_4_ = auVar94._0_4_ + auVar183._0_4_;
  auVar269._4_4_ = auVar94._4_4_ + auVar183._4_4_;
  auVar269._8_4_ = auVar94._8_4_ + auVar183._8_4_;
  auVar269._12_4_ = auVar94._12_4_ + auVar183._12_4_;
  fVar262 = auVar128._0_4_;
  auVar277._0_4_ = fVar262 * auVar200._0_4_;
  fVar263 = auVar128._4_4_;
  auVar277._4_4_ = fVar263 * auVar200._4_4_;
  fVar194 = auVar128._8_4_;
  auVar277._8_4_ = fVar194 * auVar200._8_4_;
  fVar195 = auVar128._12_4_;
  auVar277._12_4_ = fVar195 * auVar200._12_4_;
  auVar94 = vmaxps_avx(auVar221,auVar155);
  auVar222._0_4_ = fVar262 * auVar213._0_4_;
  auVar222._4_4_ = fVar263 * auVar213._4_4_;
  auVar222._8_4_ = fVar194 * auVar213._8_4_;
  auVar222._12_4_ = fVar195 * auVar213._12_4_;
  fVar90 = auVar241._0_4_;
  auVar104._0_4_ = fVar90 * auVar200._0_4_;
  fVar163 = auVar241._4_4_;
  auVar104._4_4_ = fVar163 * auVar200._4_4_;
  fVar62 = auVar241._8_4_;
  auVar104._8_4_ = fVar62 * auVar200._8_4_;
  fVar228 = auVar241._12_4_;
  auVar104._12_4_ = fVar228 * auVar200._12_4_;
  auVar238._0_4_ = fVar90 * auVar213._0_4_;
  auVar238._4_4_ = fVar163 * auVar213._4_4_;
  auVar238._8_4_ = fVar62 * auVar213._8_4_;
  auVar238._12_4_ = fVar228 * auVar213._12_4_;
  auVar120._0_4_ = auVar9._0_4_ + auVar94._0_4_;
  auVar120._4_4_ = auVar9._4_4_ + auVar94._4_4_;
  auVar120._8_4_ = auVar9._8_4_ + auVar94._8_4_;
  auVar120._12_4_ = auVar9._12_4_ + auVar94._12_4_;
  auVar156._8_8_ = 0x3f800000;
  auVar156._0_8_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar156,auVar120);
  auVar94 = vsubps_avx(auVar156,auVar269);
  auVar270._0_4_ = fVar262 * auVar9._0_4_;
  auVar270._4_4_ = fVar263 * auVar9._4_4_;
  auVar270._8_4_ = fVar194 * auVar9._8_4_;
  auVar270._12_4_ = fVar195 * auVar9._12_4_;
  auVar255._0_4_ = fVar262 * auVar94._0_4_;
  auVar255._4_4_ = fVar263 * auVar94._4_4_;
  auVar255._8_4_ = fVar194 * auVar94._8_4_;
  auVar255._12_4_ = fVar195 * auVar94._12_4_;
  auVar121._0_4_ = fVar90 * auVar9._0_4_;
  auVar121._4_4_ = fVar163 * auVar9._4_4_;
  auVar121._8_4_ = fVar62 * auVar9._8_4_;
  auVar121._12_4_ = fVar228 * auVar9._12_4_;
  auVar157._0_4_ = fVar90 * auVar94._0_4_;
  auVar157._4_4_ = fVar163 * auVar94._4_4_;
  auVar157._8_4_ = fVar62 * auVar94._8_4_;
  auVar157._12_4_ = fVar228 * auVar94._12_4_;
  auVar9 = vminps_avx(auVar270,auVar255);
  auVar94 = vminps_avx(auVar121,auVar157);
  auVar9 = vminps_avx(auVar9,auVar94);
  auVar94 = vmaxps_avx(auVar255,auVar270);
  auVar183 = vmaxps_avx(auVar157,auVar121);
  auVar243 = vminps_avx(auVar277,auVar222);
  auVar200 = vminps_avx(auVar104,auVar238);
  auVar243 = vminps_avx(auVar243,auVar200);
  auVar9 = vhaddps_avx(auVar9,auVar243);
  auVar94 = vmaxps_avx(auVar183,auVar94);
  auVar183 = vmaxps_avx(auVar222,auVar277);
  auVar243 = vmaxps_avx(auVar238,auVar104);
  auVar183 = vmaxps_avx(auVar243,auVar183);
  auVar94 = vhaddps_avx(auVar94,auVar183);
  auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
  auVar94 = vshufps_avx(auVar94,auVar94,0xe8);
  auVar239._0_4_ = auVar272._0_4_ + auVar9._0_4_;
  auVar239._4_4_ = auVar272._4_4_ + auVar9._4_4_;
  auVar239._8_4_ = auVar272._8_4_ + auVar9._8_4_;
  auVar239._12_4_ = auVar272._12_4_ + auVar9._12_4_;
  auVar223._0_4_ = auVar272._0_4_ + auVar94._0_4_;
  auVar223._4_4_ = auVar272._4_4_ + auVar94._4_4_;
  auVar223._8_4_ = auVar272._8_4_ + auVar94._8_4_;
  auVar223._12_4_ = auVar272._12_4_ + auVar94._12_4_;
  auVar226 = ZEXT1664(auVar223);
  auVar9 = vmaxps_avx(auVar252,auVar239);
  auVar94 = vminps_avx(auVar223,auVar75);
  auVar9 = vcmpps_avx(auVar94,auVar9,1);
  auVar9 = vshufps_avx(auVar9,auVar9,0x50);
  if ((auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar9[0xf] < '\0')
  goto LAB_015d80f6;
  bVar51 = 0;
  if ((auVar193._0_4_ < auVar239._0_4_) && (bVar51 = 0, auVar223._0_4_ < auVar75._0_4_)) {
    auVar94 = vmovshdup_avx(auVar239);
    auVar9 = vcmpps_avx(auVar223,auVar75,1);
    bVar51 = auVar9[4] & auVar273._0_4_ < auVar94._0_4_;
  }
  if (((3 < (uint)uVar50 || fVar89 < 0.001) | bVar51) == 1) {
    lVar53 = 200;
    auVar226 = ZEXT1664(auVar13);
    do {
      fVar163 = auVar272._0_4_;
      fVar90 = 1.0 - fVar163;
      fVar89 = fVar90 * fVar90 * fVar90;
      fVar91 = fVar163 * 3.0 * fVar90 * fVar90;
      fVar90 = fVar90 * fVar163 * fVar163 * 3.0;
      auVar143._4_4_ = fVar89;
      auVar143._0_4_ = fVar89;
      auVar143._8_4_ = fVar89;
      auVar143._12_4_ = fVar89;
      auVar122._4_4_ = fVar91;
      auVar122._0_4_ = fVar91;
      auVar122._8_4_ = fVar91;
      auVar122._12_4_ = fVar91;
      auVar105._4_4_ = fVar90;
      auVar105._0_4_ = fVar90;
      auVar105._8_4_ = fVar90;
      auVar105._12_4_ = fVar90;
      fVar163 = fVar163 * fVar163 * fVar163;
      auVar158._0_4_ = (float)local_3a0._0_4_ * fVar163;
      auVar158._4_4_ = (float)local_3a0._4_4_ * fVar163;
      auVar158._8_4_ = fStack_398 * fVar163;
      auVar158._12_4_ = fStack_394 * fVar163;
      auVar8 = vfmadd231ps_fma(auVar158,auVar13,auVar105);
      auVar8 = vfmadd231ps_fma(auVar8,auVar12,auVar122);
      auVar8 = vfmadd231ps_fma(auVar8,auVar11,auVar143);
      auVar106._8_8_ = auVar8._0_8_;
      auVar106._0_8_ = auVar8._0_8_;
      auVar8 = vshufpd_avx(auVar8,auVar8,3);
      auVar9 = vshufps_avx(auVar272,auVar272,0x55);
      auVar8 = vsubps_avx(auVar8,auVar106);
      auVar9 = vfmadd213ps_fma(auVar8,auVar9,auVar106);
      fVar89 = auVar9._0_4_;
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar107._0_4_ = fVar123 * fVar89 + fVar88 * auVar8._0_4_;
      auVar107._4_4_ = auVar282._4_4_ * fVar89 + auVar66._4_4_ * auVar8._4_4_;
      auVar107._8_4_ = auVar282._8_4_ * fVar89 + auVar66._8_4_ * auVar8._8_4_;
      auVar107._12_4_ = auVar282._12_4_ * fVar89 + auVar66._12_4_ * auVar8._12_4_;
      auVar272 = vsubps_avx(auVar272,auVar107);
      auVar8 = vandps_avx(auVar248,auVar9);
      auVar9 = vshufps_avx(auVar8,auVar8,0xf5);
      auVar8 = vmaxss_avx(auVar9,auVar8);
      if (auVar8._0_4_ < fVar87) {
        local_120 = auVar272._0_4_;
        if ((0.0 <= local_120) && (local_120 <= 1.0)) {
          auVar8 = vmovshdup_avx(auVar272);
          fVar89 = auVar8._0_4_;
          if ((0.0 <= fVar89) && (fVar89 <= 1.0)) {
            auVar9 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                   ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
            auVar243 = vinsertps_avx(auVar9,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28
                                    );
            auVar9 = vdpps_avx(auVar243,auVar64,0x7f);
            auVar282 = vdpps_avx(auVar243,auVar96,0x7f);
            auVar66 = vdpps_avx(auVar243,local_3b0,0x7f);
            auVar94 = vdpps_avx(auVar243,local_3c0,0x7f);
            auVar252 = vdpps_avx(auVar243,local_3d0,0x7f);
            auVar75 = vdpps_avx(auVar243,local_3e0,0x7f);
            auVar183 = vdpps_avx(auVar243,local_3f0,0x7f);
            auVar243 = vdpps_avx(auVar243,local_400,0x7f);
            fVar91 = 1.0 - fVar89;
            auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar89 * auVar252._0_4_)),ZEXT416((uint)fVar91),
                                     auVar9);
            auVar282 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * fVar89)),ZEXT416((uint)fVar91)
                                       ,auVar282);
            auVar226 = ZEXT1664(auVar282);
            auVar66 = vfmadd231ss_fma(ZEXT416((uint)(auVar183._0_4_ * fVar89)),ZEXT416((uint)fVar91)
                                      ,auVar66);
            auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar89 * auVar243._0_4_)),ZEXT416((uint)fVar91)
                                      ,auVar94);
            fVar88 = 1.0 - local_120;
            fVar89 = fVar88 * local_120 * local_120 * 3.0;
            fVar163 = local_120 * local_120 * local_120;
            auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar163 * auVar94._0_4_)),ZEXT416((uint)fVar89)
                                      ,auVar66);
            fVar91 = local_120 * 3.0 * fVar88 * fVar88;
            auVar282 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar91),auVar282);
            fVar123 = fVar88 * fVar88 * fVar88;
            auVar9 = vfmadd231ss_fma(auVar282,ZEXT416((uint)fVar123),auVar9);
            fVar90 = auVar9._0_4_;
            if ((fVar60 <= fVar90) && (fVar62 = *(float *)(ray + k * 4 + 0x100), fVar90 <= fVar62))
            {
              pGVar4 = (context->scene->geometries).items[uVar48].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_015d8f06:
                bVar51 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar51 = 1, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar9 = vshufps_avx(auVar272,auVar272,0x55);
                auVar224._8_4_ = 0x3f800000;
                auVar224._0_8_ = 0x3f8000003f800000;
                auVar224._12_4_ = 0x3f800000;
                auVar282 = vsubps_avx(auVar224,auVar9);
                fVar228 = auVar9._0_4_;
                auVar240._0_4_ = fVar228 * auVar230._0_4_;
                fVar262 = auVar9._4_4_;
                auVar240._4_4_ = fVar262 * auVar230._4_4_;
                fVar263 = auVar9._8_4_;
                auVar240._8_4_ = fVar263 * auVar230._8_4_;
                fVar194 = auVar9._12_4_;
                auVar240._12_4_ = fVar194 * auVar230._12_4_;
                auVar246._0_4_ = fVar228 * auVar68._0_4_;
                auVar246._4_4_ = fVar262 * auVar68._4_4_;
                auVar246._8_4_ = fVar263 * auVar68._8_4_;
                auVar246._12_4_ = fVar194 * auVar68._12_4_;
                local_5a0 = auVar124._0_4_;
                fStack_59c = auVar124._4_4_;
                fStack_598 = auVar124._8_4_;
                fStack_594 = auVar124._12_4_;
                auVar256._0_4_ = fVar228 * local_5a0;
                auVar256._4_4_ = fVar262 * fStack_59c;
                auVar256._8_4_ = fVar263 * fStack_598;
                auVar256._12_4_ = fVar194 * fStack_594;
                auVar206._0_4_ = fVar228 * fVar162;
                auVar206._4_4_ = fVar262 * fVar180;
                auVar206._8_4_ = fVar263 * fVar181;
                auVar206._12_4_ = fVar194 * fVar182;
                auVar9 = vfmadd231ps_fma(auVar240,auVar282,auVar65);
                auVar66 = vfmadd231ps_fma(auVar246,auVar282,auVar126);
                auVar94 = vfmadd231ps_fma(auVar256,auVar282,auVar95);
                auVar252 = vfmadd231ps_fma(auVar206,auVar282,auVar113);
                auVar282 = vsubps_avx(auVar66,auVar9);
                auVar226 = ZEXT1664(auVar282);
                auVar9 = vsubps_avx(auVar94,auVar66);
                auVar66 = vsubps_avx(auVar252,auVar94);
                auVar257._0_4_ = local_120 * auVar9._0_4_;
                auVar257._4_4_ = local_120 * auVar9._4_4_;
                auVar257._8_4_ = local_120 * auVar9._8_4_;
                auVar257._12_4_ = local_120 * auVar9._12_4_;
                auVar190._4_4_ = fVar88;
                auVar190._0_4_ = fVar88;
                auVar190._8_4_ = fVar88;
                auVar190._12_4_ = fVar88;
                auVar94 = vfmadd231ps_fma(auVar257,auVar190,auVar282);
                auVar207._0_4_ = local_120 * auVar66._0_4_;
                auVar207._4_4_ = local_120 * auVar66._4_4_;
                auVar207._8_4_ = local_120 * auVar66._8_4_;
                auVar207._12_4_ = local_120 * auVar66._12_4_;
                auVar9 = vfmadd231ps_fma(auVar207,auVar190,auVar9);
                auVar208._0_4_ = local_120 * auVar9._0_4_;
                auVar208._4_4_ = local_120 * auVar9._4_4_;
                auVar208._8_4_ = local_120 * auVar9._8_4_;
                auVar208._12_4_ = local_120 * auVar9._12_4_;
                auVar66 = vfmadd231ps_fma(auVar208,auVar190,auVar94);
                auVar178._0_4_ = fVar163 * (float)local_460._0_4_;
                auVar178._4_4_ = fVar163 * (float)local_460._4_4_;
                auVar178._8_4_ = fVar163 * fStack_458;
                auVar178._12_4_ = fVar163 * fStack_454;
                auVar133._4_4_ = fVar89;
                auVar133._0_4_ = fVar89;
                auVar133._8_4_ = fVar89;
                auVar133._12_4_ = fVar89;
                auVar9 = vfmadd132ps_fma(auVar133,auVar178,local_450);
                auVar159._4_4_ = fVar91;
                auVar159._0_4_ = fVar91;
                auVar159._8_4_ = fVar91;
                auVar159._12_4_ = fVar91;
                auVar9 = vfmadd132ps_fma(auVar159,auVar9,local_440);
                auVar134._0_4_ = auVar66._0_4_ * 3.0;
                auVar134._4_4_ = auVar66._4_4_ * 3.0;
                auVar134._8_4_ = auVar66._8_4_ * 3.0;
                auVar134._12_4_ = auVar66._12_4_ * 3.0;
                auVar144._4_4_ = fVar123;
                auVar144._0_4_ = fVar123;
                auVar144._8_4_ = fVar123;
                auVar144._12_4_ = fVar123;
                auVar66 = vfmadd132ps_fma(auVar144,auVar9,local_430);
                auVar9 = vshufps_avx(auVar134,auVar134,0xc9);
                auVar160._0_4_ = auVar66._0_4_ * auVar9._0_4_;
                auVar160._4_4_ = auVar66._4_4_ * auVar9._4_4_;
                auVar160._8_4_ = auVar66._8_4_ * auVar9._8_4_;
                auVar160._12_4_ = auVar66._12_4_ * auVar9._12_4_;
                auVar9 = vshufps_avx(auVar66,auVar66,0xc9);
                auVar66 = vfmsub231ps_fma(auVar160,auVar134,auVar9);
                auVar9 = vmovshdup_avx(auVar66);
                local_180 = auVar9._0_8_;
                uStack_178 = local_180;
                uStack_170 = local_180;
                uStack_168 = local_180;
                auVar9 = vshufps_avx(auVar66,auVar66,0xaa);
                local_160 = auVar9._0_8_;
                uStack_158 = local_160;
                uStack_150 = local_160;
                uStack_148 = local_160;
                local_140 = auVar66._0_4_;
                uStack_13c = local_140;
                uStack_138 = local_140;
                uStack_134 = local_140;
                uStack_130 = local_140;
                uStack_12c = local_140;
                uStack_128 = local_140;
                uStack_124 = local_140;
                fStack_11c = local_120;
                fStack_118 = local_120;
                fStack_114 = local_120;
                fStack_110 = local_120;
                fStack_10c = local_120;
                fStack_108 = local_120;
                fStack_104 = local_120;
                local_100 = auVar8._0_8_;
                uStack_f8 = local_100;
                uStack_f0 = local_100;
                uStack_e8 = local_100;
                local_e0 = CONCAT44(uStack_2dc,local_2e0);
                uStack_d8 = CONCAT44(uStack_2d4,uStack_2d8);
                uStack_d0 = CONCAT44(uStack_2cc,uStack_2d0);
                uStack_c8 = CONCAT44(uStack_2c4,uStack_2c8);
                local_c0._4_4_ = uStack_2bc;
                local_c0._0_4_ = local_2c0;
                local_c0._8_4_ = uStack_2b8;
                local_c0._12_4_ = uStack_2b4;
                local_c0._16_4_ = uStack_2b0;
                local_c0._20_4_ = uStack_2ac;
                local_c0._24_4_ = uStack_2a8;
                local_c0._28_4_ = uStack_2a4;
                vpcmpeqd_avx2(local_c0,local_c0);
                uStack_9c = context->user->instID[0];
                local_a0 = uStack_9c;
                uStack_98 = uStack_9c;
                uStack_94 = uStack_9c;
                uStack_90 = uStack_9c;
                uStack_8c = uStack_9c;
                uStack_88 = uStack_9c;
                uStack_84 = uStack_9c;
                uStack_7c = context->user->instPrimID[0];
                local_80 = uStack_7c;
                uStack_78 = uStack_7c;
                uStack_74 = uStack_7c;
                uStack_70 = uStack_7c;
                uStack_6c = uStack_7c;
                uStack_68 = uStack_7c;
                uStack_64 = uStack_7c;
                *(float *)(ray + k * 4 + 0x100) = fVar90;
                local_480 = local_300;
                local_4f0.valid = (int *)local_480;
                local_4f0.geometryUserPtr = pGVar4->userPtr;
                local_4f0.context = context->user;
                local_4f0.ray = (RTCRayN *)ray;
                local_4f0.hit = (RTCHitN *)&local_180;
                local_4f0.N = 8;
                if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar226 = ZEXT1664(auVar282);
                  (*pGVar4->occlusionFilterN)(&local_4f0);
                }
                auVar83 = vpcmpeqd_avx2(local_480,_DAT_01faff00);
                auVar83 = _DAT_01fe9960 & ~auVar83;
                if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar83 >> 0x7f,0) != '\0') ||
                      (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar83 >> 0xbf,0) != '\0') ||
                    (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar83[0x1f] < '\0') {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar226 = ZEXT1664(auVar226._0_16_);
                    (*p_Var5)(&local_4f0);
                  }
                  auVar15 = vpcmpeqd_avx2(local_480,_DAT_01faff00);
                  auVar112._8_4_ = 0xff800000;
                  auVar112._0_8_ = 0xff800000ff800000;
                  auVar112._12_4_ = 0xff800000;
                  auVar112._16_4_ = 0xff800000;
                  auVar112._20_4_ = 0xff800000;
                  auVar112._24_4_ = 0xff800000;
                  auVar112._28_4_ = 0xff800000;
                  auVar83 = vblendvps_avx(auVar112,*(undefined1 (*) [32])(local_4f0.ray + 0x100),
                                          auVar15);
                  *(undefined1 (*) [32])(local_4f0.ray + 0x100) = auVar83;
                  auVar83 = _DAT_01fe9960 & ~auVar15;
                  if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar83 >> 0x7f,0) != '\0') ||
                        (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar83 >> 0xbf,0) != '\0') ||
                      (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar83[0x1f] < '\0') {
                    bVar51 = 1;
                    goto LAB_015d8f08;
                  }
                }
                *(float *)(ray + k * 4 + 0x100) = fVar62;
                goto LAB_015d8f06;
              }
LAB_015d8f08:
              bVar59 = (bool)(bVar59 | bVar51);
            }
          }
        }
        break;
      }
      lVar53 = lVar53 + -1;
    } while (lVar53 != 0);
    goto LAB_015d80f6;
  }
  local_410 = vinsertps_avx(auVar8,ZEXT416((uint)fVar91),0x10);
  auVar70 = vinsertps_avx(auVar273,ZEXT416((uint)auVar70._0_4_),0x10);
  goto LAB_015d7b3e;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }